

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O1

PackageMempoolAcceptResult * __thiscall
anon_unknown.dwarf_3f792fb::MemPoolAccept::AcceptMultipleTransactions
          (PackageMempoolAcceptResult *__return_storage_ptr__,MemPoolAccept *this,
          vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          *txns,ATMPArgs *args)

{
  CAmount *pCVar1;
  size_t *psVar2;
  undefined1 *puVar3;
  pointer *pptVar4;
  list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *replaced_txns;
  long lVar5;
  pointer psVar6;
  element_type *peVar7;
  setEntries *psVar8;
  _Base_ptr p_Var9;
  pointer pcVar10;
  size_t sVar11;
  CTransactionRef *pCVar12;
  CTransaction *tx;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  CTxMemPool *pCVar14;
  uint64_t mempool_sequence;
  ValidationSignals *this_00;
  undefined8 uVar15;
  undefined8 uVar16;
  PackageValidationState state;
  TxValidationState state_00;
  PackageValidationState state_01;
  PackageValidationState state_02;
  TxValidationState state_03;
  PackageValidationState state_04;
  TxValidationState state_05;
  PackageValidationState state_06;
  TxValidationState state_07;
  PackageValidationState state_08;
  PackageValidationState state_09;
  PackageValidationState state_10;
  TxValidationState state_11;
  TxValidationState state_12;
  TxValidationState state_13;
  PackageValidationState state_14;
  PackageValidationState state_15;
  pointer __first;
  void *pvVar17;
  undefined1 uVar18;
  size_type sVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  byte bVar23;
  uint uVar24;
  pointer pWVar25;
  ulong uVar26;
  pointer pWVar27;
  long lVar28;
  _Alloc_hider _Var29;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  long lVar30;
  undefined7 extraout_var_03;
  undefined7 extraout_var_04;
  undefined7 extraout_var_05;
  undefined7 uVar34;
  Logger *pLVar31;
  int64_t iVar32;
  _Rb_tree_node_base *p_Var33;
  _Tp_alloc_type *p_Var35;
  ulong uVar36;
  string *limits;
  Workspace *__args;
  Workspace *__args_00;
  long lVar37;
  Workspace *extraout_RDX;
  Workspace *extraout_RDX_00;
  Workspace *extraout_RDX_01;
  Workspace *extraout_RDX_02;
  Workspace *extraout_RDX_03;
  Workspace *extraout_RDX_04;
  Workspace *extraout_RDX_05;
  Workspace *extraout_RDX_06;
  Workspace *extraout_RDX_07;
  Workspace *extraout_RDX_08;
  Workspace *extraout_RDX_09;
  Workspace *extraout_RDX_10;
  Workspace *extraout_RDX_11;
  Workspace *extraout_RDX_12;
  Workspace *extraout_RDX_13;
  Workspace *extraout_RDX_14;
  Workspace *extraout_RDX_15;
  Workspace *extraout_RDX_16;
  Workspace *extraout_RDX_17;
  Workspace *extraout_RDX_18;
  Workspace *extraout_RDX_19;
  Workspace *extraout_RDX_20;
  Workspace *extraout_RDX_21;
  Workspace *extraout_RDX_22;
  Workspace *pWVar38;
  _Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
  *p_Var39;
  setEntries *psVar40;
  size_type __n;
  pointer pWVar41;
  setEntries *psVar42;
  PackageValidationState *state_16;
  undefined8 uVar43;
  byte *pbVar44;
  undefined8 uVar45;
  long *plVar46;
  CFeeRate relay_fee;
  pointer psVar47;
  iterator __end1;
  _Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
  *this_01;
  pointer pWVar48;
  pointer __n_00;
  iterator __begin1;
  long *plVar49;
  long in_FS_OFFSET;
  initializer_list<std::pair<const_uint256,_MempoolAcceptResult>_> __l;
  initializer_list<transaction_identifier<true>_> __l_00;
  initializer_list<transaction_identifier<true>_> __l_01;
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  undefined7 uStack_9d8;
  byte local_9d1;
  undefined8 local_9d0;
  setEntries *__range1;
  pointer local_9c0;
  undefined8 local_9b8;
  uint local_9b0;
  undefined4 uStack_9ac;
  undefined8 local_9a8;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *local_9a0;
  pointer local_998;
  CFeeRate local_990;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
  all_package_wtxids;
  CFeeRate package_feerate;
  vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
  local_968;
  FeeEstimateMode local_948;
  FeeEstimateMode local_944;
  CFeeRate package_feerate_1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock8;
  undefined1 local_928 [8];
  long *local_920;
  long local_910 [2];
  long *local_900 [2];
  long local_8f0 [2];
  undefined1 local_8e0 [8];
  long *local_8d8;
  long local_8c8 [2];
  long *local_8b8 [2];
  long local_8a8 [2];
  undefined1 local_898 [8];
  long *local_890;
  long local_880 [2];
  long *local_870 [2];
  long local_860 [2];
  undefined1 local_850 [8];
  _Base_ptr *local_848;
  _Base_ptr local_838 [2];
  long *local_828 [2];
  long local_818 [2];
  undefined8 local_808;
  long *local_800 [2];
  long local_7f0 [2];
  long *local_7e0 [2];
  long local_7d0 [2];
  undefined1 local_7c0 [8];
  long *local_7b8;
  long local_7a8 [2];
  long *local_798 [2];
  long local_788 [2];
  undefined1 local_778 [8];
  long *local_770;
  long local_760 [2];
  long *local_750 [2];
  long local_740 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> err;
  string local_708 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_700;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6f0;
  _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_6e0 [3];
  _Storage<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false>
  local_698;
  bool local_680;
  undefined1 local_650 [8];
  long *local_648;
  long local_638 [2];
  long *local_628 [2];
  long local_618 [2];
  TxValidationState placeholder_state;
  undefined1 local_5c0 [8];
  _Base_ptr *local_5b8;
  _Base_ptr local_5a8 [2];
  long *local_598 [2];
  long local_588 [2];
  undefined1 local_578 [8];
  pointer local_570;
  _Base_ptr local_560 [2];
  long *local_550 [2];
  long local_540 [2];
  undefined8 local_530;
  long *local_528 [2];
  long local_518 [2];
  long *local_508 [2];
  long local_4f8 [2];
  undefined1 local_4e8 [8];
  pointer local_4e0;
  _Base_ptr local_4d0 [2];
  long *local_4c0 [2];
  long local_4b0 [2];
  undefined8 local_4a0;
  long *local_498 [2];
  long local_488 [2];
  long *local_478 [2];
  long local_468 [2];
  map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
  results;
  undefined1 local_428 [8];
  _Base_ptr *local_420;
  _Base_ptr local_410 [2];
  long *local_400 [2];
  long local_3f0 [2];
  PackageValidationState package_state;
  Result<void> result;
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_328;
  _Storage<CFeeRate,_true> local_310;
  _Head_base<0UL,_CTxMemPoolEntry_*,_false> _Stack_308;
  _Storage<std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>,_false>
  local_300;
  bool local_2e8;
  _Storage<uint256,_true> local_2e0;
  undefined1 local_2c0 [32];
  _Alloc_hider local_2a0;
  size_type local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  undefined1 local_280 [264];
  undefined1 local_178 [32];
  undefined1 local_158 [8];
  char *local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  long *local_130 [2];
  long local_120 [2];
  CFeeRate parent_feerate;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  undefined1 local_f0 [8];
  char *local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  long *local_c8 [2];
  long local_b8 [2];
  size_type __dnew_1;
  undefined1 auStack_a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90 [2];
  __index_type local_68;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
  effective_feerate_wtxids_1;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  package_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                 field_2;
  package_state.super_ValidationState<PackageValidationResult>.m_mode = M_VALID;
  package_state.super_ValidationState<PackageValidationResult>.m_result = PCKG_RESULT_UNSET;
  package_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length = 0;
  package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._M_local_buf
  [0] = '\0';
  package_state.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                 field_2;
  package_state.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length = 0;
  package_state.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._M_local_buf
  [0] = '\0';
  state_16 = &package_state;
  bVar20 = IsWellFormedPackage(txns,state_16,true);
  if (bVar20) {
    local_968.
    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_968.
    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_968.
    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    p_Var39 = (_Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
               *)((long)(txns->
                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(txns->
                        super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 4);
    if ((_Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
         *)0x38e38e38e38e38 < p_Var39) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
        std::__throw_length_error("vector::reserve");
LAB_00b0ef71:
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
          std::__throw_bad_optional_access();
        }
      }
      goto LAB_00b0fda7;
    }
    p_Var35 = (_Tp_alloc_type *)0x8e38e38e38e38e39;
    if (p_Var39 !=
        (_Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
         *)0x0) {
      pWVar25 = std::
                _Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                ::_M_allocate(p_Var39,(size_t)state_16);
      std::
      vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
      ::_S_relocate((pointer)0x0,(pointer)0x0,pWVar25,p_Var35);
      local_968.
      super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pWVar25 + (long)p_Var39;
      local_968.
      super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
      ._M_impl.super__Vector_impl_data._M_finish = pWVar25;
    }
    psVar47 = (txns->
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    psVar6 = (txns->
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    local_968.
    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_968.
         super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar47 != psVar6) {
      __range1._0_4_ =
           (uint)local_968.
                 super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      __range1._4_4_ =
           (undefined4)
           ((ulong)local_968.
                   super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                   ._M_impl.super__Vector_impl_data._M_finish >> 0x20);
      local_9c0 = local_968.
                  super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_9b0 = (uint)psVar6;
      uStack_9ac = (undefined4)((ulong)psVar6 >> 0x20);
      pWVar25 = local_968.
                super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      do {
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_ =
             (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                    super__Copy_ctor_alias<bilingual_str,_std::monostate> + 8;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_4_ = 0;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
        _M_storage[0x10] = '\0';
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ = 0;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
        _M_storage[0x18] =
             (uchar)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
             (undefined7)
             ((ulong)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_ >> 8);
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._40_8_ = 0;
        local_348._0_8_ =
             (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                    super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x38;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._56_4_ = 0;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_index = '\0';
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._65_7_ = 0;
        local_348._8_8_ = (_List_node_base *)0x0;
        local_338._8_4_ = _S_red;
        local_328._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
        local_328._M_impl._M_node.super__List_node_base._M_prev =
             (_List_node_base *)((long)local_338 + 8);
        local_2e0._0_8_ = (void *)0x0;
        local_300._0_1_ = false;
        local_310 = (_Storage<CFeeRate,_true>)0x0;
        _Stack_308._M_head_impl = (CTxMemPoolEntry *)0x0;
        local_2e0._16_8_ =
             &((psVar47->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
              ->hash;
        local_2e0._24_8_ = 0;
        local_2c0._0_8_ = local_2c0 + 0x10;
        local_2c0._8_8_ = 0;
        local_2c0[0x10] = '\0';
        local_2a0._M_p = (pointer)&local_290;
        local_298 = 0;
        local_290._M_local_buf[0] = '\0';
        local_328._M_impl._M_node._M_size =
             (size_t)local_328._M_impl._M_node.super__List_node_base._M_prev;
        local_2e0._8_8_ = psVar47;
        memset(local_280,0,0x102);
        local_178._0_8_ = (pointer)0x0;
        local_178[8] = 0;
        local_178._9_7_ = 0;
        local_178[0x10] = 0;
        local_178._17_8_ = 0;
        if (pWVar25 == local_9c0) {
          pWVar27 = (pointer)CONCAT44(__range1._4_4_,(uint)__range1);
          lVar37 = (long)pWVar25 - (long)pWVar27;
          if (lVar37 == 0x7ffffffffffffe00) {
            local_968.
            super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = local_9c0;
            local_968.
            super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
            ._M_impl.super__Vector_impl_data._M_start = pWVar27;
            local_968.
            super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
            ._M_impl.super__Vector_impl_data._M_finish = pWVar25;
            if (*(long *)(in_FS_OFFSET + 0x28) != lVar5) goto LAB_00b0fda7;
            std::__throw_length_error("vector::_M_realloc_insert");
            goto LAB_00b0ef32;
          }
          uVar26 = (lVar37 >> 6) * -0x71c71c71c71c71c7;
          uVar36 = 1;
          if (pWVar25 != pWVar27) {
            uVar36 = uVar26;
          }
          p_Var39 = (_Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                     *)(uVar36 + uVar26);
          if ((_Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
               *)0x38e38e38e38e37 < p_Var39) {
            p_Var39 = (_Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                       *)0x38e38e38e38e38;
          }
          p_Var35 = (_Tp_alloc_type *)(uVar36 + uVar26);
          this_01 = (_Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                     *)0x38e38e38e38e38;
          if (!CARRY8(uVar36,uVar26)) {
            this_01 = p_Var39;
          }
          pWVar27 = std::
                    _Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                    ::_M_allocate(this_01,0x38e38e38e38e38);
          std::allocator_traits<std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>::
          construct<(anonymous_namespace)::MemPoolAccept::Workspace,(anonymous_namespace)::MemPoolAccept::Workspace>
                    ((allocator_type *)(lVar37 + (long)pWVar27),(Workspace *)&result,__args_00);
          __first = (pointer)CONCAT44(__range1._4_4_,(uint)__range1);
          pWVar25 = std::
                    vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                    ::_S_relocate(__first,pWVar25,pWVar27,p_Var35);
          if (__first != (pointer)0x0) {
            operator_delete(__first,(long)local_9c0 - (long)__first);
          }
          local_9c0 = pWVar27 + (long)this_01;
          __range1._0_4_ = (uint)pWVar27;
          __range1._4_4_ = (undefined4)((ulong)pWVar27 >> 0x20);
        }
        else {
          std::allocator_traits<std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>>::
          construct<(anonymous_namespace)::MemPoolAccept::Workspace,(anonymous_namespace)::MemPoolAccept::Workspace>
                    ((allocator_type *)pWVar25,(Workspace *)&result,__args);
        }
        std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                  ((vector<CTxOut,_std::allocator<CTxOut>_> *)local_178);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a0._M_p != &local_290) {
          operator_delete(local_2a0._M_p,
                          CONCAT71(local_290._M_allocated_capacity._1_7_,local_290._M_local_buf[0])
                          + 1);
        }
        if ((undefined1 *)local_2c0._0_8_ != local_2c0 + 0x10) {
          operator_delete((void *)local_2c0._0_8_,CONCAT71(local_2c0._17_7_,local_2c0[0x10]) + 1);
        }
        if (_Stack_308._M_head_impl != (CTxMemPoolEntry *)0x0) {
          std::default_delete<CTxMemPoolEntry>::operator()
                    ((default_delete<CTxMemPoolEntry> *)&_Stack_308,_Stack_308._M_head_impl);
        }
        pWVar25 = pWVar25 + 1;
        _Stack_308._M_head_impl = (CTxMemPoolEntry *)0x0;
        std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)local_338);
        std::_Rb_tree<$270907ca$>::~_Rb_tree
                  ((_Rb_tree<_270907ca_> *)
                   ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                           super__Move_assign_alias<bilingual_str,_std::monostate>.
                           super__Copy_assign_alias<bilingual_str,_std::monostate>.
                           super__Move_ctor_alias<bilingual_str,_std::monostate>.
                           super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x30));
        std::
        _Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
        ::~_Rb_tree((_Rb_tree<transaction_identifier<false>,_transaction_identifier<false>,_std::_Identity<transaction_identifier<false>_>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
                     *)&result);
        psVar47 = psVar47 + 1;
      } while (psVar47 != psVar6);
      local_968.
      super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = local_9c0;
      local_968.
      super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(__range1._4_4_,(uint)__range1);
      local_968.
      super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
      ._M_impl.super__Vector_impl_data._M_finish = pWVar25;
    }
    results._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &results._M_t._M_impl.super__Rb_tree_header._M_header;
    results._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    results._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    results._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    criticalblock8.super_unique_lock._M_device = &(this->m_pool->cs).super_recursive_mutex;
    criticalblock8.super_unique_lock._M_owns = false;
    results._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         results._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::unique_lock<std::recursive_mutex>::lock(&criticalblock8.super_unique_lock);
    pWVar25 = local_968.
              super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_968.
        super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_968.
        super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pWVar27 = local_968.
                super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        bVar20 = PreChecks(this,args,pWVar27);
        if (!bVar20) {
          pvVar17 = (void *)((long)&result.m_variant.
                                    super__Variant_base<bilingual_str,_std::monostate>.
                                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x10);
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
          _M_storage[0] = (uchar)pvVar17;
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
               (undefined7)((ulong)pvVar17 >> 8);
          std::__cxx11::string::_M_construct<char_const*>((string *)&result,"transaction failed","")
          ;
          _Var29._M_p = (pointer)((long)&err.
                                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                         ._M_payload.
                                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                         .
                                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                         ._M_payload + 0x10);
          err.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)_Var29._M_p;
          std::__cxx11::string::_M_construct<char_const*>((string *)&err,"");
          ValidationState<PackageValidationResult>::Invalid
                    (&package_state.super_ValidationState<PackageValidationResult>,PCKG_TX,
                     (string *)&result,(string *)&err);
          if (err.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_dataplus._M_p != (_Alloc_hider)_Var29._M_p) {
            operator_delete((void *)err.
                                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ._M_payload._M_value._M_dataplus._M_p,
                            err.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._16_8_ + 1);
          }
          if ((void *)CONCAT71(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                               super__Move_assign_alias<bilingual_str,_std::monostate>.
                               super__Copy_assign_alias<bilingual_str,_std::monostate>.
                               super__Move_ctor_alias<bilingual_str,_std::monostate>.
                               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                               super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                               _1_7_,result.m_variant.
                                     super__Variant_base<bilingual_str,_std::monostate>.
                                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                     _M_u._M_first._M_storage._M_storage[0]) != pvVar17) {
            operator_delete((void *)CONCAT71(result.m_variant.
                                             super__Variant_base<bilingual_str,_std::monostate>.
                                             super__Move_assign_alias<bilingual_str,_std::monostate>
                                             .
                                             super__Copy_assign_alias<bilingual_str,_std::monostate>
                                             .super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                             super__Variant_storage_alias<bilingual_str,_std::monostate>
                                             ._M_u._1_7_,
                                             result.m_variant.
                                             super__Variant_base<bilingual_str,_std::monostate>.
                                             super__Move_assign_alias<bilingual_str,_std::monostate>
                                             .
                                             super__Copy_assign_alias<bilingual_str,_std::monostate>
                                             .super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                             super__Variant_storage_alias<bilingual_str,_std::monostate>
                                             ._M_u._M_first._M_storage._M_storage[0]),
                            CONCAT71(result.m_variant.
                                     super__Variant_base<bilingual_str,_std::monostate>.
                                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                     _M_u._17_7_,
                                     result.m_variant.
                                     super__Variant_base<bilingual_str,_std::monostate>.
                                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                     _M_u._M_first._M_storage._M_storage[0x10]) + 1);
          }
          peVar7 = (pWVar27->m_ptx->
                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_4a0._0_4_ = (pWVar27->m_state).super_ValidationState<TxValidationResult>.m_mode;
          local_4a0._4_4_ = (pWVar27->m_state).super_ValidationState<TxValidationResult>.m_result;
          pcVar10 = (pWVar27->m_state).super_ValidationState<TxValidationResult>.m_reject_reason.
                    _M_dataplus._M_p;
          local_498[0] = local_488;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_498,pcVar10,
                     pcVar10 + (pWVar27->m_state).super_ValidationState<TxValidationResult>.
                               m_reject_reason._M_string_length);
          pcVar10 = (pWVar27->m_state).super_ValidationState<TxValidationResult>.m_debug_message.
                    _M_dataplus._M_p;
          local_478[0] = local_468;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_478,pcVar10,
                     pcVar10 + (pWVar27->m_state).super_ValidationState<TxValidationResult>.
                               m_debug_message._M_string_length);
          state_00.super_ValidationState<TxValidationResult>.m_result._3_1_ = local_9d1;
          state_00.super_ValidationState<TxValidationResult>._0_7_ = uStack_9d8;
          state_00.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
               (pointer)this;
          state_00.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._0_4_
               = (uint)__range1;
          state_00.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._4_4_
               = __range1._4_4_;
          state_00.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity = (size_type)local_9c0;
          state_00.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ = args;
          state_00.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p._0_4_
               = local_9b0;
          state_00.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p._4_4_
               = uStack_9ac;
          state_00.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length =
               (size_type)__return_storage_ptr__;
          state_00.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
          _M_allocated_capacity = (size_type)txns;
          state_00.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
               local_998;
          MempoolAcceptResult::Failure((MempoolAcceptResult *)&result,state_00);
          std::
          _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
          ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                    ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                      *)&results,&peVar7->m_witness_hash,(MempoolAcceptResult *)&result);
          if (local_2e8 == true) {
            local_2e8 = false;
            pvVar17 = (void *)CONCAT71(local_300._1_7_,local_300._0_1_);
            if (pvVar17 != (void *)0x0) {
              operator_delete(pvVar17,(long)local_300._M_value.
                                            super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)pvVar17);
            }
          }
          std::__cxx11::
          _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
          ::_M_clear((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                      *)local_348);
          if ((__index_type *)
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._48_8_ !=
              (__index_type *)
              ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                      super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x40U)) {
            operator_delete((void *)result.m_variant.
                                    super__Variant_base<bilingual_str,_std::monostate>.
                                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u
                                    ._48_8_,
                            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                            super__Variant_storage_alias<bilingual_str,_std::monostate>._64_8_ + 1);
          }
          if ((void *)CONCAT71(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                               super__Move_assign_alias<bilingual_str,_std::monostate>.
                               super__Copy_assign_alias<bilingual_str,_std::monostate>.
                               super__Move_ctor_alias<bilingual_str,_std::monostate>.
                               super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                               super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                               _17_7_,result.m_variant.
                                      super__Variant_base<bilingual_str,_std::monostate>.
                                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                      super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                      _M_u._M_first._M_storage._M_storage[0x10]) !=
              (void *)((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x20U)) {
            operator_delete((void *)CONCAT71(result.m_variant.
                                             super__Variant_base<bilingual_str,_std::monostate>.
                                             super__Move_assign_alias<bilingual_str,_std::monostate>
                                             .
                                             super__Copy_assign_alias<bilingual_str,_std::monostate>
                                             .super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                             super__Variant_storage_alias<bilingual_str,_std::monostate>
                                             ._M_u._17_7_,
                                             result.m_variant.
                                             super__Variant_base<bilingual_str,_std::monostate>.
                                             super__Move_assign_alias<bilingual_str,_std::monostate>
                                             .
                                             super__Copy_assign_alias<bilingual_str,_std::monostate>
                                             .super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                             super__Variant_storage_alias<bilingual_str,_std::monostate>
                                             ._M_u._M_first._M_storage._M_storage[0x10]),
                            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_
                            + 1);
          }
          if (local_478[0] != local_468) {
            operator_delete(local_478[0],local_468[0] + 1);
          }
          if (local_498[0] != local_488) {
            operator_delete(local_498[0],local_488[0] + 1);
          }
          local_4e8._0_4_ = package_state.super_ValidationState<PackageValidationResult>.m_mode;
          local_4e8._4_4_ = package_state.super_ValidationState<PackageValidationResult>.m_result;
          local_4e0 = (pointer)local_4d0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4e0,
                     package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                     _M_dataplus._M_p,
                     package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                     _M_dataplus._M_p +
                     package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                     _M_string_length);
          local_4c0[0] = local_4b0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_4c0,
                     package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                     _M_dataplus._M_p,
                     package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                     _M_dataplus._M_p +
                     package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                     _M_string_length);
          state_01.super_ValidationState<PackageValidationResult>.m_result._3_1_ = local_9d1;
          state_01.super_ValidationState<PackageValidationResult>._0_7_ = uStack_9d8;
          state_01.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
               (pointer)this;
          state_01.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length.
          _0_4_ = (uint)__range1;
          state_01.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length.
          _4_4_ = __range1._4_4_;
          state_01.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity = (size_type)local_9c0;
          state_01.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ =
               args;
          state_01.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p.
          _0_4_ = local_9b0;
          state_01.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p.
          _4_4_ = uStack_9ac;
          state_01.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
               (size_type)__return_storage_ptr__;
          state_01.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
          _M_allocated_capacity = (size_type)txns;
          state_01.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
               local_998;
          PackageMempoolAcceptResult::PackageMempoolAcceptResult
                    (__return_storage_ptr__,state_01,
                     (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                      *)local_4e8);
          if (local_4c0[0] != local_4b0) {
            operator_delete(local_4c0[0],local_4b0[0] + 1);
          }
          uVar43 = local_4e0;
          if (local_4e0 != (pointer)local_4d0) goto LAB_00b0c90c;
          goto LAB_00b0e7d4;
        }
        if ((args->m_client_maxfeerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
            super__Optional_payload_base<CFeeRate>._M_engaged == true) {
          CFeeRate::CFeeRate((CFeeRate *)&result,&pWVar27->m_modified_fees,
                             (uint32_t)pWVar27->m_vsize);
          if ((args->m_client_maxfeerate).super__Optional_base<CFeeRate,_true,_true>._M_payload.
              super__Optional_payload_base<CFeeRate>._M_engaged == false) goto LAB_00b0ef32;
          if ((long)(args->m_client_maxfeerate).super__Optional_base<CFeeRate,_true,_true>.
                    _M_payload.super__Optional_payload_base<CFeeRate>._M_payload <
              CONCAT71(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_,
                       result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first.
                       _M_storage._M_storage[0])) {
            pvVar17 = (void *)((long)&result.m_variant.
                                      super__Variant_base<bilingual_str,_std::monostate>.
                                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                      super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x10);
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
            _M_storage[0] = (uchar)pvVar17;
            uVar18 = result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first.
                     _M_storage._M_storage[0];
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                 (undefined7)((ulong)pvVar17 >> 8);
            uVar34 = result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&result,"max feerate exceeded","");
            _Var29._M_p = (pointer)((long)&err.
                                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                           ._M_payload.
                                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                           .
                                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           ._M_payload + 0x10);
            err.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)_Var29._M_p;
            std::__cxx11::string::_M_construct<char_const*>((string *)&err,"");
            ValidationState<TxValidationResult>::Invalid
                      (&(pWVar27->m_state).super_ValidationState<TxValidationResult>,
                       TX_MEMPOOL_POLICY,(string *)&result,(string *)&err);
            if (err.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_payload._M_value._M_dataplus._M_p != (_Alloc_hider)_Var29._M_p) {
              operator_delete((void *)err.
                                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ._M_payload._M_value._M_dataplus._M_p,
                              err.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload._16_8_ + 1);
            }
            if ((void *)CONCAT71(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>
                                 .super__Move_assign_alias<bilingual_str,_std::monostate>.
                                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                 super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                 _1_7_,result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._M_first._M_storage._M_storage[0]) != pvVar17) {
              operator_delete((void *)CONCAT71(result.m_variant.
                                               super__Variant_base<bilingual_str,_std::monostate>.
                                               super__Move_assign_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Copy_assign_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Move_ctor_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Variant_storage_alias<bilingual_str,_std::monostate>
                                               ._M_u._1_7_,
                                               result.m_variant.
                                               super__Variant_base<bilingual_str,_std::monostate>.
                                               super__Move_assign_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Copy_assign_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Move_ctor_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Variant_storage_alias<bilingual_str,_std::monostate>
                                               ._M_u._M_first._M_storage._M_storage[0]),
                              CONCAT71(result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._17_7_,
                                       result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._M_first._M_storage._M_storage[0x10]) + 1);
            }
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
            _M_storage[0] = uVar18;
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ = uVar34;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&result,"transaction failed","");
            err.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)_Var29._M_p;
            std::__cxx11::string::_M_construct<char_const*>((string *)&err,"");
            ValidationState<PackageValidationResult>::Invalid
                      (&package_state.super_ValidationState<PackageValidationResult>,PCKG_TX,
                       (string *)&result,(string *)&err);
            if (err.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_payload._M_value._M_dataplus._M_p != (_Alloc_hider)_Var29._M_p) {
              operator_delete((void *)err.
                                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ._M_payload._M_value._M_dataplus._M_p,
                              err.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload._16_8_ + 1);
            }
            if ((void *)CONCAT71(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>
                                 .super__Move_assign_alias<bilingual_str,_std::monostate>.
                                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                 super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                 _1_7_,result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._M_first._M_storage._M_storage[0]) != pvVar17) {
              operator_delete((void *)CONCAT71(result.m_variant.
                                               super__Variant_base<bilingual_str,_std::monostate>.
                                               super__Move_assign_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Copy_assign_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Move_ctor_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Variant_storage_alias<bilingual_str,_std::monostate>
                                               ._M_u._1_7_,
                                               result.m_variant.
                                               super__Variant_base<bilingual_str,_std::monostate>.
                                               super__Move_assign_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Copy_assign_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Move_ctor_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Variant_storage_alias<bilingual_str,_std::monostate>
                                               ._M_u._M_first._M_storage._M_storage[0]),
                              CONCAT71(result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._17_7_,
                                       result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._M_first._M_storage._M_storage[0x10]) + 1);
            }
            peVar7 = (pWVar27->m_ptx->
                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            local_530._0_4_ = (pWVar27->m_state).super_ValidationState<TxValidationResult>.m_mode;
            local_530._4_4_ = (pWVar27->m_state).super_ValidationState<TxValidationResult>.m_result;
            pcVar10 = (pWVar27->m_state).super_ValidationState<TxValidationResult>.m_reject_reason.
                      _M_dataplus._M_p;
            local_528[0] = local_518;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_528,pcVar10,
                       pcVar10 + (pWVar27->m_state).super_ValidationState<TxValidationResult>.
                                 m_reject_reason._M_string_length);
            pcVar10 = (pWVar27->m_state).super_ValidationState<TxValidationResult>.m_debug_message.
                      _M_dataplus._M_p;
            local_508[0] = local_4f8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_508,pcVar10,
                       pcVar10 + (pWVar27->m_state).super_ValidationState<TxValidationResult>.
                                 m_debug_message._M_string_length);
            state_03.super_ValidationState<TxValidationResult>.m_result._3_1_ = local_9d1;
            state_03.super_ValidationState<TxValidationResult>._0_7_ = uStack_9d8;
            state_03.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
                 (pointer)this;
            state_03.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length.
            _0_4_ = (uint)__range1;
            state_03.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length.
            _4_4_ = __range1._4_4_;
            state_03.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
            _M_allocated_capacity = (size_type)local_9c0;
            state_03.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ = args;
            state_03.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p.
            _0_4_ = local_9b0;
            state_03.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p.
            _4_4_ = uStack_9ac;
            state_03.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length =
                 (size_type)__return_storage_ptr__;
            state_03.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
            _M_allocated_capacity = (size_type)txns;
            state_03.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
                 local_998;
            MempoolAcceptResult::Failure((MempoolAcceptResult *)&result,state_03);
            std::
            _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
            ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                      ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                        *)&results,&peVar7->m_witness_hash,(MempoolAcceptResult *)&result);
            if (local_2e8 == true) {
              local_2e8 = false;
              pvVar17 = (void *)CONCAT71(local_300._1_7_,local_300._0_1_);
              if (pvVar17 != (void *)0x0) {
                operator_delete(pvVar17,(long)local_300._M_value.
                                              super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)pvVar17);
              }
            }
            std::__cxx11::
            _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::_M_clear((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        *)local_348);
            if ((__index_type *)
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._48_8_ !=
                (__index_type *)
                ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x40U)) {
              operator_delete((void *)result.m_variant.
                                      super__Variant_base<bilingual_str,_std::monostate>.
                                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                      super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                      _M_u._48_8_,
                              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                              super__Variant_storage_alias<bilingual_str,_std::monostate>._64_8_ + 1
                             );
            }
            if ((void *)CONCAT71(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>
                                 .super__Move_assign_alias<bilingual_str,_std::monostate>.
                                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                 super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                 _17_7_,result.m_variant.
                                        super__Variant_base<bilingual_str,_std::monostate>.
                                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                        super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                        _M_u._M_first._M_storage._M_storage[0x10]) !=
                (void *)((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x20U)) {
              operator_delete((void *)CONCAT71(result.m_variant.
                                               super__Variant_base<bilingual_str,_std::monostate>.
                                               super__Move_assign_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Copy_assign_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Move_ctor_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Variant_storage_alias<bilingual_str,_std::monostate>
                                               ._M_u._17_7_,
                                               result.m_variant.
                                               super__Variant_base<bilingual_str,_std::monostate>.
                                               super__Move_assign_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Copy_assign_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Move_ctor_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Variant_storage_alias<bilingual_str,_std::monostate>
                                               ._M_u._M_first._M_storage._M_storage[0x10]),
                              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                              _32_8_ + 1);
            }
            if (local_508[0] != local_4f8) {
              operator_delete(local_508[0],local_4f8[0] + 1);
            }
            if (local_528[0] != local_518) {
              operator_delete(local_528[0],local_518[0] + 1);
            }
            local_578._0_4_ = package_state.super_ValidationState<PackageValidationResult>.m_mode;
            local_578._4_4_ = package_state.super_ValidationState<PackageValidationResult>.m_result;
            local_570 = (pointer)local_560;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_570,
                       package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                       _M_dataplus._M_p,
                       package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                       _M_dataplus._M_p +
                       package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                       _M_string_length);
            local_550[0] = local_540;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_550,
                       package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                       _M_dataplus._M_p,
                       package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                       _M_dataplus._M_p +
                       package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                       _M_string_length);
            state_04.super_ValidationState<PackageValidationResult>.m_result._3_1_ = local_9d1;
            state_04.super_ValidationState<PackageValidationResult>._0_7_ = uStack_9d8;
            state_04.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p
                 = (pointer)this;
            state_04.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length
            ._0_4_ = (uint)__range1;
            state_04.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length
            ._4_4_ = __range1._4_4_;
            state_04.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
            _M_allocated_capacity = (size_type)local_9c0;
            state_04.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ =
                 args;
            state_04.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p
            ._0_4_ = local_9b0;
            state_04.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p
            ._4_4_ = uStack_9ac;
            state_04.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length
                 = (size_type)__return_storage_ptr__;
            state_04.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
            _M_allocated_capacity = (size_type)txns;
            state_04.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
                 local_998;
            PackageMempoolAcceptResult::PackageMempoolAcceptResult
                      (__return_storage_ptr__,state_04,
                       (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                        *)local_578);
            if (local_550[0] != local_540) {
              operator_delete(local_550[0],local_540[0] + 1);
            }
            local_4d0[0] = local_560[0];
            uVar43 = local_570;
            if (local_570 != (pointer)local_560) goto LAB_00b0c90c;
            goto LAB_00b0e7d4;
          }
        }
        CCoinsViewMemPool::PackageAddTransaction(&this->m_viewmempool,pWVar27->m_ptx);
        pWVar27 = pWVar27 + 1;
      } while (pWVar27 != pWVar25);
    }
    pWVar25 = local_968.
              super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_968.
        super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_968.
        super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00b0bce9:
      pWVar41 = local_968.
                super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      pWVar27 = local_968.
                super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar37 = 0;
      for (pWVar25 = local_968.
                     super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pWVar25 !=
          local_968.
          super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
          ._M_impl.super__Vector_impl_data._M_finish; pWVar25 = pWVar25 + 1) {
        lVar37 = lVar37 + pWVar25->m_vsize;
      }
      local_9c0 = (pointer)&this->m_subpackage;
      (this->m_subpackage).m_total_vsize = lVar37;
      lVar28 = 0;
      for (pWVar25 = local_968.
                     super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          pWVar25 !=
          local_968.
          super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
          ._M_impl.super__Vector_impl_data._M_finish; pWVar25 = pWVar25 + 1) {
        lVar28 = lVar28 + pWVar25->m_modified_fees;
      }
      ((SubPackageState *)local_9c0)->m_total_modified_fees = lVar28;
      CFeeRate::CFeeRate(&package_feerate,(CAmount *)local_9c0,(uint32_t)lVar37);
      all_package_wtxids.
      super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      all_package_wtxids.
      super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      all_package_wtxids.
      super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __n = ((long)pWVar41 - (long)pWVar27 >> 6) * -0x71c71c71c71c71c7;
      std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
      reserve(&all_package_wtxids,__n);
      pWVar38 = extraout_RDX;
      if (pWVar27 != pWVar41) {
        do {
          peVar7 = (pWVar27->m_ptx->
                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          uVar43 = *(undefined8 *)
                    (peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
          uVar45 = *(undefined8 *)
                    ((long)(peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                    + 8);
          uVar15 = *(undefined8 *)
                    ((long)(peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                    + 0x10);
          uVar16 = *(undefined8 *)
                    ((long)(peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                    + 0x18);
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
          _M_storage[0x10] = (uchar)uVar15;
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
               (undefined7)((ulong)uVar15 >> 8);
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
          _M_storage[0x18] = (uchar)uVar16;
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
               (undefined7)((ulong)uVar16 >> 8);
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
          _M_storage[0] = (uchar)uVar43;
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
               (undefined7)((ulong)uVar43 >> 8);
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_4_ =
               (undefined4)uVar45;
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
               (undefined4)((ulong)uVar45 >> 0x20);
          if (all_package_wtxids.
              super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              all_package_wtxids.
              super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>::
            _M_realloc_insert<transaction_identifier<true>>
                      ((vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>
                        *)&all_package_wtxids,
                       (iterator)
                       all_package_wtxids.
                       super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (transaction_identifier<true> *)&result);
            pWVar38 = extraout_RDX_00;
          }
          else {
            uVar43 = *(undefined8 *)
                      (peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
            uVar45 = *(undefined8 *)
                      ((long)(peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                             _M_elems + 8);
            uVar15 = *(undefined8 *)
                      ((long)(peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                             _M_elems + 0x18);
            *(undefined8 *)
             (((all_package_wtxids.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->m_wrapped).super_base_blob<256U>.m_data
              ._M_elems + 0x10) =
                 *(undefined8 *)
                  ((long)(peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                  0x10);
            *(undefined8 *)
             (((all_package_wtxids.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->m_wrapped).super_base_blob<256U>.m_data
              ._M_elems + 0x18) = uVar15;
            *(undefined8 *)
             ((all_package_wtxids.
               super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->m_wrapped).super_base_blob<256U>.m_data.
             _M_elems = uVar43;
            *(undefined8 *)
             (((all_package_wtxids.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->m_wrapped).super_base_blob<256U>.m_data
              ._M_elems + 8) = uVar45;
            all_package_wtxids.
            super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 all_package_wtxids.
                 super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
          pWVar27 = pWVar27 + 1;
        } while (pWVar27 != pWVar41);
      }
      placeholder_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
           (pointer)&placeholder_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                     field_2;
      placeholder_state.super_ValidationState<TxValidationResult>.m_mode = M_VALID;
      placeholder_state.super_ValidationState<TxValidationResult>.m_result = TX_RESULT_UNSET;
      placeholder_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length =
           0;
      placeholder_state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
      _M_local_buf[0] = '\0';
      placeholder_state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p =
           (pointer)&placeholder_state.super_ValidationState<TxValidationResult>.m_debug_message.
                     field_2;
      placeholder_state.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length =
           0;
      placeholder_state.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
      _M_local_buf[0] = '\0';
      if (args->m_package_feerates == true) {
        bVar20 = CheckFeeRate(this,(this->m_subpackage).m_total_vsize,
                              (this->m_subpackage).m_total_modified_fees,&placeholder_state);
        pWVar38 = extraout_RDX_01;
        if (bVar20) goto LAB_00b0be51;
        pvVar17 = (void *)((long)&result.m_variant.
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x10);
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
        _M_storage[0] = (uchar)pvVar17;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
             (undefined7)((ulong)pvVar17 >> 8);
        std::__cxx11::string::_M_construct<char_const*>((string *)&result,"transaction failed","");
        _Var29._M_p = (pointer)((long)&err.
                                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                       ._M_payload.
                                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                       .
                                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                       ._M_payload + 0x10);
        err.
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)_Var29._M_p;
        std::__cxx11::string::_M_construct<char_const*>((string *)&err,"");
        ValidationState<PackageValidationResult>::Invalid
                  (&package_state.super_ValidationState<PackageValidationResult>,PCKG_TX,
                   (string *)&result,(string *)&err);
        if (err.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_dataplus._M_p != (_Alloc_hider)_Var29._M_p) {
          operator_delete((void *)err.
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_payload._M_value._M_dataplus._M_p,
                          err.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._16_8_ + 1);
        }
        if ((void *)CONCAT71(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                             super__Move_assign_alias<bilingual_str,_std::monostate>.
                             super__Copy_assign_alias<bilingual_str,_std::monostate>.
                             super__Move_ctor_alias<bilingual_str,_std::monostate>.
                             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                             super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_,
                             result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                             super__Move_assign_alias<bilingual_str,_std::monostate>.
                             super__Copy_assign_alias<bilingual_str,_std::monostate>.
                             super__Move_ctor_alias<bilingual_str,_std::monostate>.
                             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                             super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                             _M_first._M_storage._M_storage[0]) != pvVar17) {
          operator_delete((void *)CONCAT71(result.m_variant.
                                           super__Variant_base<bilingual_str,_std::monostate>.
                                           super__Move_assign_alias<bilingual_str,_std::monostate>.
                                           super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                           super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                           super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                           super__Variant_storage_alias<bilingual_str,_std::monostate>
                                           ._M_u._1_7_,
                                           result.m_variant.
                                           super__Variant_base<bilingual_str,_std::monostate>.
                                           super__Move_assign_alias<bilingual_str,_std::monostate>.
                                           super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                           super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                           super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                           super__Variant_storage_alias<bilingual_str,_std::monostate>
                                           ._M_u._M_first._M_storage._M_storage[0]),
                          CONCAT71(result.m_variant.
                                   super__Variant_base<bilingual_str,_std::monostate>.
                                   super__Move_assign_alias<bilingual_str,_std::monostate>.
                                   super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                   super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                   super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                   super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                   _17_7_,result.m_variant.
                                          super__Variant_base<bilingual_str,_std::monostate>.
                                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                          super__Variant_storage_alias<bilingual_str,_std::monostate>
                                          ._M_u._M_first._M_storage._M_storage[0x10]) + 1);
        }
        local_650._0_4_ = package_state.super_ValidationState<PackageValidationResult>.m_mode;
        local_650._4_4_ = package_state.super_ValidationState<PackageValidationResult>.m_result;
        plVar49 = local_638;
        local_648 = plVar49;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_648,
                   package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                   _M_dataplus._M_p,
                   package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                   _M_dataplus._M_p +
                   package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                   _M_string_length);
        local_628[0] = local_618;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_628,
                   package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                   _M_dataplus._M_p,
                   package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                   _M_dataplus._M_p +
                   package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                   _M_string_length);
        peVar7 = ((pWVar41[-1].m_ptx)->
                 super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        local_778._0_4_ = placeholder_state.super_ValidationState<TxValidationResult>.m_mode;
        local_778._4_4_ = placeholder_state.super_ValidationState<TxValidationResult>.m_result;
        local_770 = local_760;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_770,
                   placeholder_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                   _M_dataplus._M_p,
                   placeholder_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                   _M_dataplus._M_p +
                   placeholder_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                   _M_string_length);
        local_750[0] = local_740;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_750,
                   placeholder_state.super_ValidationState<TxValidationResult>.m_debug_message.
                   _M_dataplus._M_p,
                   placeholder_state.super_ValidationState<TxValidationResult>.m_debug_message.
                   _M_dataplus._M_p +
                   placeholder_state.super_ValidationState<TxValidationResult>.m_debug_message.
                   _M_string_length);
        CFeeRate::CFeeRate(&local_990,(CAmount *)local_9c0,
                           (uint32_t)(this->m_subpackage).m_total_vsize);
        state_05.super_ValidationState<TxValidationResult>.m_result._3_1_ = local_9d1;
        state_05.super_ValidationState<TxValidationResult>._0_7_ = uStack_9d8;
        state_05.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
             (pointer)this;
        state_05.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._0_4_ =
             (uint)__range1;
        state_05.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length._4_4_ =
             __range1._4_4_;
        state_05.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity = (size_type)local_9c0;
        state_05.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ = args;
        state_05.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p._0_4_ =
             local_9b0;
        state_05.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p._4_4_ =
             uStack_9ac;
        state_05.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length =
             (size_type)__return_storage_ptr__;
        state_05.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
        _M_allocated_capacity = (size_type)txns;
        state_05.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ = local_998
        ;
        MempoolAcceptResult::FeeFailure
                  ((MempoolAcceptResult *)&err,state_05,(CFeeRate)local_778,
                   (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                    *)local_990.nSatoshisPerK);
        uVar43 = *(undefined8 *)
                  (peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
        uVar45 = *(undefined8 *)
                  ((long)(peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                  8);
        uVar15 = *(undefined8 *)
                  ((long)(peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                  0x10);
        uVar16 = *(undefined8 *)
                  ((long)(peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                  0x18);
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
        _M_storage[0x10] = (uchar)uVar15;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
             (undefined7)((ulong)uVar15 >> 8);
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
        _M_storage[0x18] = (uchar)uVar16;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
             (undefined7)((ulong)uVar16 >> 8);
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
        _M_storage[0] = (uchar)uVar43;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
             (undefined7)((ulong)uVar43 >> 8);
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_4_ = (undefined4)uVar45;
        result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
        super__Move_assign_alias<bilingual_str,_std::monostate>.
        super__Copy_assign_alias<bilingual_str,_std::monostate>.
        super__Move_ctor_alias<bilingual_str,_std::monostate>.
        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
        super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
             (undefined4)((ulong)uVar45 >> 0x20);
        MempoolAcceptResult::MempoolAcceptResult
                  ((MempoolAcceptResult *)
                   ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                           super__Move_assign_alias<bilingual_str,_std::monostate>.
                           super__Copy_assign_alias<bilingual_str,_std::monostate>.
                           super__Move_ctor_alias<bilingual_str,_std::monostate>.
                           super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x20),
                   (MempoolAcceptResult *)&err);
        __l._M_len = 1;
        __l._M_array = (iterator)&result;
        std::
        map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
        ::map((map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
               *)&__dnew_1,__l,(less<uint256> *)local_f0,(allocator_type *)local_158);
        state_06.super_ValidationState<PackageValidationResult>.m_result._3_1_ = local_9d1;
        state_06.super_ValidationState<PackageValidationResult>._0_7_ = uStack_9d8;
        state_06.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
             (pointer)this;
        state_06.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length.
        _0_4_ = (uint)__range1;
        state_06.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length.
        _4_4_ = __range1._4_4_;
        state_06.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
        _M_allocated_capacity = (size_type)local_9c0;
        state_06.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ = args
        ;
        state_06.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p.
        _0_4_ = local_9b0;
        state_06.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p.
        _4_4_ = uStack_9ac;
        state_06.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
             (size_type)__return_storage_ptr__;
        state_06.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
        _M_allocated_capacity = (size_type)txns;
        state_06.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
             local_998;
        PackageMempoolAcceptResult::PackageMempoolAcceptResult
                  (__return_storage_ptr__,state_06,
                   (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                    *)local_650);
        std::
        _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
        ::~_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                     *)&__dnew_1);
        if ((local_2e0._M_value.super_base_blob<256U>.m_data._M_elems[0x18] == M_INVALID) &&
           (local_2e0._24_8_ = local_2e0._24_8_ & 0xffffffffffffff00,
           (void *)local_2e0._0_8_ != (void *)0x0)) {
          operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ - local_2e0._0_8_);
        }
        std::__cxx11::
        _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::_M_clear(&local_328);
        if ((_Base_ptr)local_348._0_8_ != (_Base_ptr)local_338) {
          operator_delete((void *)local_348._0_8_,local_338._0_8_ + 1);
        }
        if ((__index_type *)
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._48_8_ !=
            (__index_type *)
            ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                    super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x40U)) {
          operator_delete((void *)result.m_variant.
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                  _48_8_,
                          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                          super__Variant_storage_alias<bilingual_str,_std::monostate>._64_8_ + 1);
        }
        if ((local_680 == true) &&
           (local_680 = false,
           local_698._M_value.
           super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
           ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
          operator_delete(local_698._M_value.
                          super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_698._M_value.
                                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage - local_698._0_8_
                         );
        }
        std::__cxx11::
        _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
        ::_M_clear(local_6e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_700._M_allocated_capacity != &local_6f0) {
          operator_delete((void *)local_700._M_allocated_capacity,
                          local_6f0._M_allocated_capacity + 1);
        }
        if ((bool *)err.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._16_8_ !=
            &err.
             super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
             ._M_payload.
             super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ._M_engaged) {
          operator_delete((void *)err.
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_payload._16_8_,
                          err.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._32_8_ + 1);
        }
        if (local_750[0] != local_740) {
          operator_delete(local_750[0],local_740[0] + 1);
        }
        if (local_770 != local_760) {
          operator_delete(local_770,local_760[0] + 1);
        }
        plVar46 = local_648;
        if (local_628[0] != local_618) {
          operator_delete(local_628[0],local_618[0] + 1);
          plVar46 = local_648;
        }
      }
      else {
LAB_00b0be51:
        psVar40 = (setEntries *)
                  (txns->
                  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        psVar8 = (setEntries *)
                 (txns->
                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        psVar42 = (setEntries *)CONCAT44(__range1._4_4_,(uint)__range1);
        if (0x10 < (ulong)((long)psVar8 - (long)psVar40)) {
          iVar32 = (this->m_subpackage).m_total_vsize;
          lVar28 = (long)psVar8 - (long)psVar40 >> 6;
          lVar37 = result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                   super__Move_assign_alias<bilingual_str,_std::monostate>.
                   super__Copy_assign_alias<bilingual_str,_std::monostate>.
                   super__Move_ctor_alias<bilingual_str,_std::monostate>.
                   super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                   super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_;
          if (0 < lVar28) {
            local_9b0 = (uint)iVar32;
            uStack_9ac = (undefined4)((ulong)iVar32 >> 0x20);
            lVar28 = lVar28 + 1;
            psVar40 = (setEntries *)
                      &(psVar40->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
            do {
              psVar42 = psVar40;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._36_4_ =
                   (undefined4)((ulong)lVar37 >> 0x20);
              peVar7 = ((pointer)(psVar42 + -1))[1].
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0] = '\0';
              uVar43 = *(undefined8 *)&(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data;
              uVar45 = *(undefined8 *)((long)&(peVar7->hash).m_wrapped.super_base_blob<256U> + 8);
              uVar15 = *(undefined8 *)((long)&(peVar7->hash).m_wrapped.super_base_blob<256U> + 0x10)
              ;
              uVar16 = *(undefined8 *)((long)&(peVar7->hash).m_wrapped.super_base_blob<256U> + 0x18)
              ;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                   (undefined7)uVar15;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x18] = (uchar)((ulong)uVar15 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                   (undefined7)uVar16;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._33_3_ =
                   (undefined3)((ulong)lVar37 >> 8);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x20] = (uchar)((ulong)uVar16 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                   (undefined7)uVar43;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[8] = (uchar)((ulong)uVar43 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._9_3_ =
                   (undefined3)uVar45;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                   (undefined4)((ulong)uVar45 >> 0x18);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x10] = (uchar)((ulong)uVar45 >> 0x38);
              bVar20 = CTxMemPool::exists(this->m_pool,(GenTxid *)&result);
              if (bVar20) {
                psVar42 = (setEntries *)((pointer)(psVar42 + -1) + 1);
LAB_00b0ccb2:
                lVar37 = CONCAT44(result.m_variant.
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                  _36_4_,result.m_variant.
                                         super__Variant_base<bilingual_str,_std::monostate>.
                                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                         super__Variant_storage_alias<bilingual_str,_std::monostate>
                                         ._M_u._32_4_);
                goto LAB_00b0ccbc;
              }
              peVar7 = ((pointer)(psVar42 + -1))[2].
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0] = '\0';
              uVar43 = *(undefined8 *)&(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data;
              uVar45 = *(undefined8 *)((long)&(peVar7->hash).m_wrapped.super_base_blob<256U> + 8);
              uVar15 = *(undefined8 *)((long)&(peVar7->hash).m_wrapped.super_base_blob<256U> + 0x10)
              ;
              uVar16 = *(undefined8 *)((long)&(peVar7->hash).m_wrapped.super_base_blob<256U> + 0x18)
              ;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                   (undefined7)uVar15;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x18] = (uchar)((ulong)uVar15 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                   (undefined7)uVar16;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x20] = (uchar)((ulong)uVar16 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                   (undefined7)uVar43;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[8] = (uchar)((ulong)uVar43 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._9_3_ =
                   (undefined3)uVar45;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                   (undefined4)((ulong)uVar45 >> 0x18);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x10] = (uchar)((ulong)uVar45 >> 0x38);
              bVar20 = CTxMemPool::exists(this->m_pool,(GenTxid *)&result);
              if (bVar20) {
                psVar42 = (setEntries *)((pointer)(psVar42 + -1) + 2);
                goto LAB_00b0ccb2;
              }
              peVar7 = *(element_type **)&(psVar42->_M_t)._M_impl;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0] = '\0';
              uVar43 = *(undefined8 *)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
              ;
              uVar45 = *(undefined8 *)
                        ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
              uVar15 = *(undefined8 *)
                        ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10
                        );
              uVar16 = *(undefined8 *)
                        ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18
                        );
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                   (undefined7)uVar15;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x18] = (uchar)((ulong)uVar15 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                   (undefined7)uVar16;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x20] = (uchar)((ulong)uVar16 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                   (undefined7)uVar43;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[8] = (uchar)((ulong)uVar43 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._9_3_ =
                   (undefined3)uVar45;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                   (undefined4)((ulong)uVar45 >> 0x18);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x10] = (uchar)((ulong)uVar45 >> 0x38);
              bVar20 = CTxMemPool::exists(this->m_pool,(GenTxid *)&result);
              if (bVar20) goto LAB_00b0ccb2;
              p_Var9 = (psVar42->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0] = '\0';
              uVar43 = *(undefined8 *)((long)&p_Var9[1]._M_right + 1);
              uVar45 = *(undefined8 *)((long)&p_Var9[2]._M_color + 1);
              uVar15 = *(undefined8 *)((long)&p_Var9[2]._M_parent + 1);
              uVar16 = *(undefined8 *)((long)&p_Var9[2]._M_left + 1);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                   (undefined7)uVar15;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x18] = (uchar)((ulong)uVar15 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                   (undefined7)uVar16;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x20] = (uchar)((ulong)uVar16 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                   (undefined7)uVar43;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[8] = (uchar)((ulong)uVar43 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._9_3_ =
                   (undefined3)uVar45;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                   (undefined4)((ulong)uVar45 >> 0x18);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x10] = (uchar)((ulong)uVar45 >> 0x38);
              bVar20 = CTxMemPool::exists(this->m_pool,(GenTxid *)&result);
              lVar37 = CONCAT44(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                _36_4_,result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._32_4_);
              if (bVar20) {
                psVar42 = (setEntries *)
                          &(psVar42->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
                goto LAB_00b0ccb2;
              }
              lVar28 = lVar28 + -1;
              psVar40 = (setEntries *)
                        &(((list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            *)(psVar42 + 1))->
                         super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                         )._M_impl._M_node._M_size;
            } while (1 < lVar28);
            psVar40 = (setEntries *)
                      &(psVar42->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right;
          }
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._36_4_ =
               (undefined4)((ulong)lVar37 >> 0x20);
          lVar28 = (long)psVar8 - (long)psVar40 >> 4;
          if (lVar28 == 1) {
LAB_00b0c02c:
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._36_4_ =
                 (undefined4)((ulong)lVar37 >> 0x20);
            peVar7 = *(element_type **)&(psVar40->_M_t)._M_impl;
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
            _M_storage[0] = '\0';
            uVar43 = *(undefined8 *)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
            uVar45 = *(undefined8 *)
                      ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
            uVar15 = *(undefined8 *)
                      ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
            uVar16 = *(undefined8 *)
                      ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                 (undefined7)uVar43;
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
            _M_storage[8] = (uchar)((ulong)uVar43 >> 0x38);
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._9_3_ =
                 (undefined3)uVar45;
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                 (undefined4)((ulong)uVar45 >> 0x18);
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
            _M_storage[0x10] = (uchar)((ulong)uVar45 >> 0x38);
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                 (undefined7)uVar15;
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
            _M_storage[0x18] = (uchar)((ulong)uVar15 >> 0x38);
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                 (undefined7)uVar16;
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._33_3_ =
                 (undefined3)((ulong)lVar37 >> 8);
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
            _M_storage[0x20] = (uchar)((ulong)uVar16 >> 0x38);
            bVar20 = CTxMemPool::exists(this->m_pool,(GenTxid *)&result);
            psVar42 = psVar40;
            if (!bVar20) {
              psVar42 = psVar8;
            }
LAB_00b0c05a:
            lVar37 = CONCAT44(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                              _36_4_,result.m_variant.
                                     super__Variant_base<bilingual_str,_std::monostate>.
                                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                     _M_u._32_4_);
          }
          else {
            if (lVar28 == 2) {
LAB_00b0bffc:
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._36_4_ =
                   (undefined4)((ulong)lVar37 >> 0x20);
              peVar7 = *(element_type **)&(psVar40->_M_t)._M_impl;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0] = '\0';
              uVar43 = *(undefined8 *)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
              ;
              uVar45 = *(undefined8 *)
                        ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
              uVar15 = *(undefined8 *)
                        ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10
                        );
              uVar16 = *(undefined8 *)
                        ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18
                        );
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                   (undefined7)uVar43;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[8] = (uchar)((ulong)uVar43 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._9_3_ =
                   (undefined3)uVar45;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                   (undefined4)((ulong)uVar45 >> 0x18);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x10] = (uchar)((ulong)uVar45 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                   (undefined7)uVar15;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x18] = (uchar)((ulong)uVar15 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                   (undefined7)uVar16;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._33_3_ =
                   (undefined3)((ulong)lVar37 >> 8);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x20] = (uchar)((ulong)uVar16 >> 0x38);
              bVar20 = CTxMemPool::exists(this->m_pool,(GenTxid *)&result);
              lVar37 = CONCAT44(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                _36_4_,result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._32_4_);
              psVar42 = psVar40;
              if (!bVar20) {
                psVar40 = (setEntries *)
                          &(psVar40->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
                goto LAB_00b0c02c;
              }
              goto LAB_00b0c05a;
            }
            psVar42 = psVar8;
            if (lVar28 == 3) {
              peVar7 = *(element_type **)&(psVar40->_M_t)._M_impl;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0] = '\0';
              uVar43 = *(undefined8 *)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
              ;
              uVar45 = *(undefined8 *)
                        ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
              uVar15 = *(undefined8 *)
                        ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10
                        );
              uVar16 = *(undefined8 *)
                        ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18
                        );
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                   (undefined7)uVar43;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[8] = (uchar)((ulong)uVar43 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._9_3_ =
                   (undefined3)uVar45;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                   (undefined4)((ulong)uVar45 >> 0x18);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x10] = (uchar)((ulong)uVar45 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                   (undefined7)uVar15;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x18] = (uchar)((ulong)uVar15 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                   (undefined7)uVar16;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._33_3_ =
                   (undefined3)((ulong)lVar37 >> 8);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x20] = (uchar)((ulong)uVar16 >> 0x38);
              bVar20 = CTxMemPool::exists(this->m_pool,(GenTxid *)&result);
              lVar37 = CONCAT44(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                _36_4_,result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._32_4_);
              psVar42 = psVar40;
              if (!bVar20) {
                psVar40 = (setEntries *)
                          &(psVar40->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
                goto LAB_00b0bffc;
              }
              goto LAB_00b0c05a;
            }
          }
LAB_00b0ccbc:
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_ = lVar37;
          if (psVar42 != psVar8) {
            __assert_fail("std::all_of(txns.cbegin(), txns.cend(), [this](const auto& tx) { return !m_pool.exists(GenTxid::Txid(tx->GetHash()));})"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                          ,0x475,
                          "bool (anonymous namespace)::MemPoolAccept::PackageMempoolChecks(const std::vector<CTransactionRef> &, std::vector<Workspace> &, const int64_t, PackageValidationState &)"
                         );
          }
          if ((long)(txns->
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(txns->
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4 != __n) {
            __assert_fail("txns.size() == workspaces.size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                          ,0x477,
                          "bool (anonymous namespace)::MemPoolAccept::PackageMempoolChecks(const std::vector<CTransactionRef> &, std::vector<Workspace> &, const int64_t, PackageValidationState &)"
                         );
          }
          CTxMemPool::CheckPackageLimits(&result,this->m_pool,txns,iVar32);
          pWVar27 = local_968.
                    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pWVar25 = local_968.
                    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_index == '\x01') {
            if ((this->m_subpackage).m_rbf != true) {
              std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
              ~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::monostate> *)&result);
              pWVar38 = extraout_RDX_02;
              psVar42 = psVar8;
              goto LAB_00b0d0ad;
            }
            if ((long)local_968.
                      super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_968.
                      super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                      ._M_impl.super__Vector_impl_data._M_start == 0x480) {
              bVar20 = IsChildWithParents(txns);
              if (bVar20) {
                uVar24 = (uint)(pWVar25 == pWVar27);
                if (pWVar25 != pWVar27) {
                  local_998 = pWVar27;
                  pWVar41 = pWVar25;
                  uVar24 = 0;
                  do {
                    local_9b0 = uVar24;
                    uStack_9ac = 0;
                    psVar40 = (setEntries *)
                              (pWVar41->m_ancestors)._M_t._M_impl.super__Rb_tree_header.
                              _M_node_count;
                    if (psVar40 != (setEntries *)0x0) {
                      err.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._M_value._M_dataplus._M_p =
                           (_Alloc_hider)
                           ((long)&err.
                                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                   ._M_payload.
                                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                   .
                                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ._M_payload + 0x10);
                      __dnew_1 = 0x41;
                      _Var29._M_p = std::__cxx11::
                                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    ::_M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)&err,&__dnew_1,0);
                      sVar19 = __dnew_1;
                      err.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._16_8_ = __dnew_1;
                      err.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)_Var29._M_p;
                      memcpy(_Var29._M_p,
                             "package RBF failed: new transaction cannot have mempool ancestors",
                             0x41);
                      err.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._M_payload._M_value._M_string_length = sVar19;
                      _Var29._M_p[sVar19] = '\0';
                      __dnew_1 = (size_type)(auStack_a0 + 8);
                      auStack_a0._0_8_ =
                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)0x0;
                      auStack_a0._8_8_ = auStack_a0._8_8_ & 0xffffffffffffff00;
                      local_9d1 = ValidationState<PackageValidationResult>::Invalid
                                            (&package_state.
                                              super_ValidationState<PackageValidationResult>,
                                             PCKG_POLICY,
                                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&err,(string *)&__dnew_1);
                      if ((undefined1 *)__dnew_1 != auStack_a0 + 8) {
                        operator_delete((void *)__dnew_1,(ulong)(auStack_a0._8_8_ + 1));
                      }
                      psVar8 = psVar40;
                      if (err.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload._M_value._M_dataplus._M_p !=
                          (pointer)((long)&err.
                                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                           ._M_payload.
                                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                           .
                                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           ._M_payload + 0x10)) {
                        operator_delete((void *)err.
                                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                                ._M_payload.
                                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                                .
                                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                                ._M_payload._M_value._M_dataplus._M_p,
                                        err.
                                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                        ._M_payload.
                                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                        .
                                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ._M_payload._16_8_ + 1);
                      }
                    }
                    uVar24 = local_9b0;
                    if (psVar40 != (setEntries *)0x0) break;
                    pWVar41 = pWVar41 + 1;
                    uVar24 = (uint)(pWVar41 == pWVar27);
                  } while (pWVar41 != pWVar27);
                }
                bVar23 = local_9d1;
                if (uVar24 != 0) {
                  err.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload._24_8_ =
                       (long)&err.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload + 8;
                  err.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload._M_value._M_string_length =
                       err.
                       super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                       ._M_payload.
                       super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                       .
                       super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ._M_payload._M_value._M_string_length & 0xffffffff00000000;
                  err.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload._16_8_ = 0;
                  local_708 = (string  [8])0x0;
                  err.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._32_8_ = err.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._24_8_;
                  if (pWVar25 != pWVar27) {
                    do {
                      std::_Rb_tree<$270907ca$>::_M_merge_unique<CompareIteratorByHash>
                                ((_Rb_tree<_270907ca_> *)&err,&(pWVar25->m_iters_conflicting)._M_t);
                      pWVar25 = pWVar25 + 1;
                    } while (pWVar25 != pWVar27);
                  }
                  pWVar25 = local_968.
                            super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  psVar40 = &(this->m_subpackage).m_all_conflicts;
                  GetEntriesForConflicts_abi_cxx11_
                            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)&__dnew_1,
                             ((local_968.
                               super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                               ._M_impl.super__Vector_impl_data._M_start[1].m_ptx)->
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                             _M_ptr,this->m_pool,(setEntries *)&err,psVar40);
                  uVar18 = local_90[0]._M_local_buf[8];
                  if (local_90[0]._M_local_buf[8] == '\x01') {
                    local_f0 = (undefined1  [8])&local_e0;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_f0,
                               "package RBF failed: too many potential replacements","");
                    local_9d1 = ValidationState<PackageValidationResult>::Invalid
                                          (&package_state.
                                            super_ValidationState<PackageValidationResult>,
                                           PCKG_POLICY,(string *)local_f0,(string *)&__dnew_1);
                    if (local_f0 != (undefined1  [8])&local_e0) {
                      operator_delete((void *)local_f0,local_e0._M_allocated_capacity + 1);
                    }
                  }
                  if ((local_90[0]._M_local_buf[8] == '\x01') &&
                     (local_90[0]._M_local_buf[8] = '\0', (undefined1 *)__dnew_1 != auStack_a0 + 8))
                  {
                    operator_delete((void *)__dnew_1,(ulong)(auStack_a0._8_8_ + 1));
                  }
                  bVar23 = local_9d1;
                  if (uVar18 == '\0') {
                    p_Var33 = (this->m_subpackage).m_all_conflicts._M_t._M_impl.
                              super__Rb_tree_header._M_header._M_left;
                    while ((_Rb_tree_header *)p_Var33 !=
                           &(this->m_subpackage).m_all_conflicts._M_t._M_impl.super__Rb_tree_header)
                    {
                      lVar37 = *(long *)(p_Var33 + 1);
                      pCVar1 = &(this->m_subpackage).m_conflicting_fees;
                      *pCVar1 = *pCVar1 + *(long *)(lVar37 + 0xa8);
                      iVar32 = GetVirtualTransactionSize
                                         ((long)*(int *)(lVar37 + 0x78),*(int64_t *)(lVar37 + 0xa0),
                                          nBytesPerSigOp);
                      psVar2 = &(this->m_subpackage).m_conflicting_size;
                      *psVar2 = *psVar2 + (long)(int)iVar32;
                      p_Var33 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var33);
                    }
                    relay_fee.nSatoshisPerK =
                         (this->m_pool->m_opts).incremental_relay_feerate.nSatoshisPerK;
                    PaysForRBF_abi_cxx11_
                              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&__dnew_1,(this->m_subpackage).m_conflicting_fees,
                               (this->m_subpackage).m_total_modified_fees,
                               (this->m_subpackage).m_total_vsize,relay_fee,
                               &((((pWVar25[1].m_ptx)->
                                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr)->hash).m_wrapped);
                    uVar18 = local_90[0]._M_local_buf[8];
                    if (local_90[0]._M_local_buf[8] == '\x01') {
                      local_f0 = (undefined1  [8])&local_e0;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_f0,"package RBF failed: insufficient anti-DoS fees"
                                 ,"");
                      local_9d1 = ValidationState<PackageValidationResult>::Invalid
                                            (&package_state.
                                              super_ValidationState<PackageValidationResult>,
                                             PCKG_POLICY,(string *)local_f0,(string *)&__dnew_1);
                      if (local_f0 != (undefined1  [8])&local_e0) {
                        operator_delete((void *)local_f0,local_e0._M_allocated_capacity + 1);
                      }
                    }
                    if ((local_90[0]._M_local_buf[8] == '\x01') &&
                       (local_90[0]._M_local_buf[8] = '\0', (undefined1 *)__dnew_1 != auStack_a0 + 8
                       )) {
                      operator_delete((void *)__dnew_1,(ulong)(auStack_a0._8_8_ + 1));
                    }
                    bVar23 = local_9d1;
                    psVar8 = psVar40;
                    if (uVar18 == '\0') {
                      CFeeRate::CFeeRate(&parent_feerate,&pWVar25->m_modified_fees,
                                         (uint32_t)pWVar25->m_vsize);
                      CFeeRate::CFeeRate(&package_feerate_1,(CAmount *)local_9c0,
                                         (uint32_t)(this->m_subpackage).m_total_vsize);
                      if (parent_feerate.nSatoshisPerK < package_feerate_1.nSatoshisPerK) {
                        ImprovesFeerateDiagram_abi_cxx11_
                                  ((optional<std::pair<DiagramCheckError,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&__dnew_1,this->m_pool,(setEntries *)&err,psVar40,
                                   (this->m_subpackage).m_total_modified_fees,
                                   (this->m_subpackage).m_total_vsize);
                        uVar18 = local_90[1]._0_1_;
                        if (local_90[1]._0_1_ == '\x01') {
                          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_f0,"package RBF failed: ",
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)auStack_a0);
                          local_150 = (char *)0x0;
                          local_148._M_local_buf[0] = '\0';
                          local_158 = (undefined1  [8])&local_148;
                          bVar23 = ValidationState<PackageValidationResult>::Invalid
                                             (&package_state.
                                               super_ValidationState<PackageValidationResult>,
                                              PCKG_POLICY,(string *)local_f0,(string *)local_158);
                          if (local_158 != (undefined1  [8])&local_148) {
                            operator_delete((void *)local_158,
                                            CONCAT71(local_148._M_allocated_capacity._1_7_,
                                                     local_148._M_local_buf[0]) + 1);
                          }
                          if (local_f0 != (undefined1  [8])&local_e0) {
                            operator_delete((void *)local_f0,local_e0._M_allocated_capacity + 1);
                          }
                        }
                        if ((local_90[1]._0_1_ == '\x01') &&
                           (local_90[1]._0_1_ = '\0',
                           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)auStack_a0._0_8_ != local_90)) {
                          operator_delete((void *)auStack_a0._0_8_,(ulong)(local_90[0]._0_8_ + 1));
                        }
                        if (uVar18 == '\0') {
                          pLVar31 = LogInstance();
                          bVar20 = BCLog::Logger::WillLogCategoryLevel(pLVar31,TXPACKAGES,Debug);
                          bVar23 = 1;
                          if (bVar20) {
                            base_blob<256u>::ToString_abi_cxx11_
                                      ((string *)&__dnew_1,
                                       &((((txns->
                                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start)->
                                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr)->hash);
                            base_blob<256u>::ToString_abi_cxx11_
                                      ((string *)local_f0,
                                       &((((txns->
                                           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start)->
                                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                         )._M_ptr)->m_witness_hash);
                            base_blob<256u>::ToString_abi_cxx11_
                                      ((string *)local_158,
                                       &((txns->
                                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish[-1].
                                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->hash);
                            base_blob<256u>::ToString_abi_cxx11_
                                      ((string *)&effective_feerate_wtxids_1,
                                       &((txns->
                                         super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                         )._M_impl.super__Vector_impl_data._M_finish[-1].
                                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->m_witness_hash);
                            source_file_00._M_str =
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                            ;
                            source_file_00._M_len = 0x5e;
                            logging_function_00._M_str = "PackageMempoolChecks";
                            logging_function_00._M_len = 0x14;
                            LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                                      (logging_function_00,source_file_00,0x4c5,TXPACKAGES,Debug,
                                       (ConstevalFormatString<4U>)0xfd76dc,(string *)&__dnew_1,
                                       (string *)local_f0,(string *)local_158,
                                       (string *)&effective_feerate_wtxids_1);
                            if (effective_feerate_wtxids_1.
                                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start !=
                                (pointer)&effective_feerate_wtxids_1.
                                          super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                              operator_delete(effective_feerate_wtxids_1.
                                              super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start,
                                              CONCAT71(effective_feerate_wtxids_1.
                                                                                                              
                                                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._1_7_,effective_feerate_wtxids_1.
                                                                                                                  
                                                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._0_1_) + 1);
                            }
                            if (local_158 != (undefined1  [8])&local_148) {
                              operator_delete((void *)local_158,
                                              CONCAT71(local_148._M_allocated_capacity._1_7_,
                                                       local_148._M_local_buf[0]) + 1);
                            }
                            if (local_f0 != (undefined1  [8])&local_e0) {
                              operator_delete((void *)local_f0,local_e0._M_allocated_capacity + 1);
                            }
                            if ((undefined1 *)__dnew_1 != auStack_a0 + 8) {
                              operator_delete((void *)__dnew_1,(ulong)(auStack_a0._8_8_ + 1));
                            }
                            bVar23 = 1;
                          }
                        }
                      }
                      else {
                        __dnew_1 = (size_type)(auStack_a0 + 8);
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&__dnew_1,
                                   "package RBF failed: package feerate is less than or equal to parent feerate"
                                   ,"");
                        local_944 = BTC_KVB;
                        CFeeRate::ToString_abi_cxx11_
                                  ((string *)local_158,&package_feerate_1,&local_944);
                        local_948 = BTC_KVB;
                        CFeeRate::ToString_abi_cxx11_
                                  ((string *)&effective_feerate_wtxids_1,&parent_feerate,&local_948)
                        ;
                        tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                                  ((string *)local_f0,
                                   (tinyformat *)"package feerate %s <= parent feerate is %s",
                                   local_158,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&effective_feerate_wtxids_1,
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)relay_fee.nSatoshisPerK);
                        bVar23 = ValidationState<PackageValidationResult>::Invalid
                                           (&package_state.
                                             super_ValidationState<PackageValidationResult>,
                                            PCKG_POLICY,(string *)&__dnew_1,(string *)local_f0);
                        if (local_f0 != (undefined1  [8])&local_e0) {
                          operator_delete((void *)local_f0,local_e0._M_allocated_capacity + 1);
                        }
                        if (effective_feerate_wtxids_1.
                            super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                            ._M_impl.super__Vector_impl_data._M_start !=
                            (pointer)&effective_feerate_wtxids_1.
                                      super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                          operator_delete(effective_feerate_wtxids_1.
                                          super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          CONCAT71(effective_feerate_wtxids_1.
                                                                                                      
                                                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._1_7_,effective_feerate_wtxids_1.
                                                                                                                  
                                                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._0_1_) + 1);
                        }
                        if (local_158 != (undefined1  [8])&local_148) {
                          operator_delete((void *)local_158,
                                          CONCAT71(local_148._M_allocated_capacity._1_7_,
                                                   local_148._M_local_buf[0]) + 1);
                        }
                        if ((undefined1 *)__dnew_1 != auStack_a0 + 8) {
                          operator_delete((void *)__dnew_1,(ulong)(auStack_a0._8_8_ + 1));
                        }
                      }
                    }
                  }
                  std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&err);
                }
                goto LAB_00b0d097;
              }
            }
            _Var29._M_p = (pointer)((long)&err.
                                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                           ._M_payload.
                                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                           .
                                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           ._M_payload + 0x10);
            __dnew_1 = 0x34;
            err.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)_Var29._M_p;
            err.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_dataplus._M_p =
                 (_Alloc_hider)
                 std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_create((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&err
                           ,&__dnew_1,0);
            err.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._16_8_ = __dnew_1;
            builtin_strncpy((char *)err.
                                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ._M_payload._M_value._M_dataplus._M_p,
                            "package RBF failed: package must be 1-parent-1-child",0x34);
            err.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_string_length = __dnew_1;
            *(char *)((long)err.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload._M_value._M_dataplus._M_p + __dnew_1) = '\0';
            auStack_a0._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            auStack_a0._8_8_ = auStack_a0._8_8_ & 0xffffffffffffff00;
            __dnew_1 = (size_type)(auStack_a0 + 8);
            bVar23 = ValidationState<PackageValidationResult>::Invalid
                               (&package_state.super_ValidationState<PackageValidationResult>,
                                PCKG_POLICY,(string *)&err,(string *)&__dnew_1);
            if ((undefined1 *)__dnew_1 != auStack_a0 + 8) {
              operator_delete((void *)__dnew_1,(ulong)(auStack_a0._8_8_ + 1));
            }
            uVar43 = err.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload._16_8_;
            uVar45 = err.
                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                     ._M_payload.
                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ._M_payload._M_value._M_dataplus._M_p;
            if (err.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_payload._M_value._M_dataplus._M_p != (_Alloc_hider)_Var29._M_p)
            goto LAB_00b0d08f;
          }
          else {
            err.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(pointer)0x16;
            __dnew_1 = (size_type)(auStack_a0 + 8);
            __dnew_1 = (size_type)
                       std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_create
                                 ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&__dnew_1,(size_type *)&err,0);
            auStack_a0._8_8_ =
                 err.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._M_value._M_dataplus._M_p;
            builtin_strncpy((char *)__dnew_1,"package-mempool-limits",0x16);
            auStack_a0._0_8_ =
                 err.
                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                 ._M_payload.
                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                 .
                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ._M_payload._M_value._M_dataplus._M_p;
            *(char *)(__dnew_1 +
                     (long)err.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_payload._M_value._M_dataplus._M_p) = '\0';
            util::ErrorString<void>((bilingual_str *)&err,&result);
            bVar23 = ValidationState<PackageValidationResult>::Invalid
                               (&package_state.super_ValidationState<PackageValidationResult>,
                                PCKG_POLICY,(string *)&__dnew_1,(string *)&err);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)err.
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   ._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._32_8_ != &local_700) {
              operator_delete((void *)err.
                                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ._32_8_,(ulong)(local_700._M_allocated_capacity + 1));
            }
            if (err.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_payload._M_value._M_dataplus._M_p !=
                (pointer)((long)&err.
                                 super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                 ._M_payload.
                                 super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                 .
                                 super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 ._M_payload + 0x10)) {
              operator_delete((void *)err.
                                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                      ._M_payload.
                                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                      .
                                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      ._M_payload._M_value._M_dataplus._M_p,
                              err.
                              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                              ._M_payload.
                              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                              .
                              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              ._M_payload._16_8_ + 1);
            }
            uVar43 = auStack_a0._8_8_;
            uVar45 = __dnew_1;
            if ((undefined1 *)__dnew_1 != auStack_a0 + 8) {
LAB_00b0d08f:
              operator_delete((void *)uVar45,
                              (ulong)((((uint256 *)&((_Base_ptr)uVar43)->_M_color)->
                                      super_base_blob<256U>).m_data._M_elems + 1));
            }
          }
LAB_00b0d097:
          __range1._4_4_ = (undefined4)((ulong)psVar8 >> 0x20);
          __range1._0_4_ = (uint)psVar8;
          std::__detail::__variant::_Variant_storage<false,_bilingual_str,_std::monostate>::
          ~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::monostate> *)&result);
          pWVar38 = extraout_RDX_03;
          psVar42 = psVar8;
          if ((bVar23 & 1) == 0) {
            local_7c0._0_4_ = package_state.super_ValidationState<PackageValidationResult>.m_mode;
            local_7c0._4_4_ = package_state.super_ValidationState<PackageValidationResult>.m_result;
            plVar49 = local_7a8;
            local_7b8 = plVar49;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_7b8,
                       package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                       _M_dataplus._M_p,
                       package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                       _M_dataplus._M_p +
                       package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                       _M_string_length);
            local_798[0] = local_788;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_798,
                       package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                       _M_dataplus._M_p,
                       package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                       _M_dataplus._M_p +
                       package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                       _M_string_length);
            state_10.super_ValidationState<PackageValidationResult>.m_result._3_1_ = local_9d1;
            state_10.super_ValidationState<PackageValidationResult>._0_7_ = uStack_9d8;
            state_10.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p
                 = (pointer)this;
            state_10.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length
            ._0_4_ = (uint)__range1;
            state_10.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length
            ._4_4_ = __range1._4_4_;
            state_10.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
            _M_allocated_capacity = (size_type)local_9c0;
            state_10.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ =
                 args;
            state_10.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p
            ._0_4_ = local_9b0;
            state_10.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p
            ._4_4_ = uStack_9ac;
            state_10.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length
                 = (size_type)__return_storage_ptr__;
            state_10.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
            _M_allocated_capacity = (size_type)txns;
            state_10.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
                 local_998;
            PackageMempoolAcceptResult::PackageMempoolAcceptResult
                      (__return_storage_ptr__,state_10,
                       (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                        *)local_7c0);
            plVar46 = local_7b8;
            if (local_798[0] != local_788) {
              operator_delete(local_798[0],local_788[0] + 1);
              plVar46 = local_7b8;
            }
            goto LAB_00b0e74e;
          }
        }
LAB_00b0d0ad:
        pWVar25 = local_968.
                  super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        __range1._4_4_ = (undefined4)((ulong)psVar42 >> 0x20);
        __range1._0_4_ = (uint)psVar42;
        if (local_968.
            super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_968.
            super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_9c0 = (pointer)&(this->m_subpackage).m_replaced_transactions;
          pWVar27 = local_968.
                    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            (pWVar27->m_package_feerate).nSatoshisPerK = package_feerate.nSatoshisPerK;
            bVar20 = PolicyScriptChecks(this,(ATMPArgs *)pWVar27,pWVar38);
            if (bVar20) {
              pWVar38 = extraout_RDX_04;
              if (args->m_test_accept == true) {
                if (args->m_package_feerates == true) {
                  __dnew_1 = (pWVar27->m_package_feerate).nSatoshisPerK;
                }
                else {
                  CFeeRate::CFeeRate((CFeeRate *)&__dnew_1,&pWVar27->m_modified_fees,
                                     (uint32_t)pWVar27->m_vsize);
                }
                if (args->m_package_feerates == true) {
                  std::
                  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                  ::vector((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                            *)&err,&all_package_wtxids);
                }
                else {
                  peVar7 = (pWVar27->m_ptx->
                           super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr;
                  uVar43 = *(undefined8 *)
                            (peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                  ;
                  uVar45 = *(undefined8 *)
                            ((long)(peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                                   _M_elems + 8);
                  uVar15 = *(undefined8 *)
                            ((long)(peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                                   _M_elems + 0x10);
                  uVar16 = *(undefined8 *)
                            ((long)(peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                                   _M_elems + 0x18);
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first.
                  _M_storage._M_storage[0x10] = (uchar)uVar15;
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                       (undefined7)((ulong)uVar15 >> 8);
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first.
                  _M_storage._M_storage[0x18] = (uchar)uVar16;
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                       (undefined7)((ulong)uVar16 >> 8);
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first.
                  _M_storage._M_storage[0] = (uchar)uVar43;
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                       (undefined7)((ulong)uVar43 >> 8);
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_4_ =
                       (undefined4)uVar45;
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                       (undefined4)((ulong)uVar45 >> 0x20);
                  __l_00._M_len = 1;
                  __l_00._M_array = (iterator)&result;
                  std::
                  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                  ::vector((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                            *)&err,__l_00,(allocator_type *)&local_944);
                }
                peVar7 = (pWVar27->m_ptx->
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                MempoolAcceptResult::MempoolAcceptResult
                          ((MempoolAcceptResult *)&result,
                           (list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            *)local_9c0,pWVar27->m_vsize,pWVar27->m_base_fees,(CFeeRate)__dnew_1,
                           (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                            *)&err);
                std::
                _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                          ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                            *)&results,&peVar7->m_witness_hash,(MempoolAcceptResult *)&result);
                if (local_2e8 == true) {
                  local_2e8 = false;
                  pvVar17 = (void *)CONCAT71(local_300._1_7_,local_300._0_1_);
                  if (pvVar17 != (void *)0x0) {
                    operator_delete(pvVar17,(long)local_300._M_value.
                                                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)pvVar17);
                  }
                }
                std::__cxx11::
                _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ::_M_clear((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            *)local_348);
                pWVar38 = extraout_RDX_07;
                if ((__index_type *)
                    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._48_8_ !=
                    (__index_type *)
                    ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                            super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x40U)) {
                  operator_delete((void *)result.m_variant.
                                          super__Variant_base<bilingual_str,_std::monostate>.
                                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                          super__Variant_storage_alias<bilingual_str,_std::monostate>
                                          ._M_u._48_8_,
                                  result.m_variant.
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate>._64_8_
                                  + 1);
                  pWVar38 = extraout_RDX_08;
                }
                if ((void *)CONCAT71(result.m_variant.
                                     super__Variant_base<bilingual_str,_std::monostate>.
                                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                     _M_u._17_7_,
                                     result.m_variant.
                                     super__Variant_base<bilingual_str,_std::monostate>.
                                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                     _M_u._M_first._M_storage._M_storage[0x10]) !=
                    (void *)((long)&result.m_variant.
                                    super__Variant_base<bilingual_str,_std::monostate>.
                                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x20U))
                {
                  operator_delete((void *)CONCAT71(result.m_variant.
                                                                                                      
                                                  super__Variant_base<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                  ._M_u._17_7_,
                                                  result.m_variant.
                                                  super__Variant_base<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                  ._M_u._M_first._M_storage._M_storage[0x10]),
                                  result.m_variant.
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                  _32_8_ + 1);
                  pWVar38 = extraout_RDX_09;
                }
                if (err.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._M_value._M_dataplus._M_p != (pointer)0x0) {
                  pbVar44 = (byte *)(err.
                                     super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                     ._M_payload.
                                     super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                     .
                                     super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     ._M_payload._16_8_ -
                                    err.
                                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                    ._M_payload.
                                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                    .
                                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    ._M_payload._0_8_);
                  uVar43 = err.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_payload._M_value._M_dataplus._M_p;
                  goto LAB_00b0d579;
                }
              }
            }
            else {
              puVar3 = (undefined1 *)
                       ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                               super__Move_assign_alias<bilingual_str,_std::monostate>.
                               super__Copy_assign_alias<bilingual_str,_std::monostate>.
                               super__Move_ctor_alias<bilingual_str,_std::monostate>.
                               super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x10);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0] = (uchar)puVar3;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                   (undefined7)((ulong)puVar3 >> 8);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&result,"transaction failed","");
              err.
              super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
              ._M_payload.
              super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ._M_payload._M_value._M_dataplus._M_p =
                   (_Alloc_hider)
                   ((long)&err.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_payload + 0x10);
              std::__cxx11::string::_M_construct<char_const*>((string *)&err,"");
              ValidationState<PackageValidationResult>::Invalid
                        (&package_state.super_ValidationState<PackageValidationResult>,PCKG_TX,
                         (string *)&result,(string *)&err);
              if (err.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload._M_value._M_dataplus._M_p !=
                  (pointer)((long)&err.
                                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                   ._M_payload.
                                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                   .
                                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ._M_payload + 0x10)) {
                operator_delete((void *)err.
                                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                        ._M_payload.
                                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                        .
                                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        ._M_payload._M_value._M_dataplus._M_p,
                                err.
                                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                ._M_payload.
                                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                .
                                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                ._M_payload._16_8_ + 1);
              }
              if ((void *)CONCAT71(result.m_variant.
                                   super__Variant_base<bilingual_str,_std::monostate>.
                                   super__Move_assign_alias<bilingual_str,_std::monostate>.
                                   super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                   super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                   super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                   super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                   _1_7_,result.m_variant.
                                         super__Variant_base<bilingual_str,_std::monostate>.
                                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                         super__Variant_storage_alias<bilingual_str,_std::monostate>
                                         ._M_u._M_first._M_storage._M_storage[0]) !=
                  (void *)((long)&result.m_variant.
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x10U)) {
                operator_delete((void *)CONCAT71(result.m_variant.
                                                 super__Variant_base<bilingual_str,_std::monostate>.
                                                 super__Move_assign_alias<bilingual_str,_std::monostate>
                                                 .
                                                 super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                 .
                                                 super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                 .
                                                 super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                 .
                                                 super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                 ._M_u._1_7_,
                                                 result.m_variant.
                                                 super__Variant_base<bilingual_str,_std::monostate>.
                                                 super__Move_assign_alias<bilingual_str,_std::monostate>
                                                 .
                                                 super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                 .
                                                 super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                 .
                                                 super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                 .
                                                 super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                 ._M_u._M_first._M_storage._M_storage[0]),
                                CONCAT71(result.m_variant.
                                         super__Variant_base<bilingual_str,_std::monostate>.
                                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                         super__Variant_storage_alias<bilingual_str,_std::monostate>
                                         ._M_u._17_7_,
                                         result.m_variant.
                                         super__Variant_base<bilingual_str,_std::monostate>.
                                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                         super__Variant_storage_alias<bilingual_str,_std::monostate>
                                         ._M_u._M_first._M_storage._M_storage[0x10]) + 1);
              }
              peVar7 = (pWVar27->m_ptx->
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              local_808._0_4_ = (pWVar27->m_state).super_ValidationState<TxValidationResult>.m_mode;
              local_808._4_4_ =
                   (pWVar27->m_state).super_ValidationState<TxValidationResult>.m_result;
              local_800[0] = local_7f0;
              pcVar10 = (pWVar27->m_state).super_ValidationState<TxValidationResult>.m_reject_reason
                        ._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_800,pcVar10,
                         pcVar10 + (pWVar27->m_state).super_ValidationState<TxValidationResult>.
                                   m_reject_reason._M_string_length);
              local_7e0[0] = local_7d0;
              pcVar10 = (pWVar27->m_state).super_ValidationState<TxValidationResult>.m_debug_message
                        ._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_7e0,pcVar10,
                         pcVar10 + (pWVar27->m_state).super_ValidationState<TxValidationResult>.
                                   m_debug_message._M_string_length);
              state_07.super_ValidationState<TxValidationResult>.m_result._3_1_ = local_9d1;
              state_07.super_ValidationState<TxValidationResult>._0_7_ = uStack_9d8;
              state_07.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
                   (pointer)this;
              state_07.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length.
              _0_4_ = (uint)__range1;
              state_07.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length.
              _4_4_ = __range1._4_4_;
              state_07.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
              _M_allocated_capacity = (size_type)local_9c0;
              state_07.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ =
                   args;
              state_07.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p.
              _0_4_ = local_9b0;
              state_07.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p.
              _4_4_ = uStack_9ac;
              state_07.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length =
                   (size_type)__return_storage_ptr__;
              state_07.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
              _M_allocated_capacity = (size_type)txns;
              state_07.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
                   local_998;
              MempoolAcceptResult::Failure((MempoolAcceptResult *)&result,state_07);
              std::
              _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
              ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                        ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                          *)&results,&peVar7->m_witness_hash,(MempoolAcceptResult *)&result);
              if (local_2e8 == true) {
                local_2e8 = false;
                pvVar17 = (void *)CONCAT71(local_300._1_7_,local_300._0_1_);
                if (pvVar17 != (void *)0x0) {
                  operator_delete(pvVar17,(long)local_300._M_value.
                                                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)pvVar17);
                }
              }
              std::__cxx11::
              _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ::_M_clear((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                          *)local_348);
              if ((__index_type *)
                  result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._48_8_ !=
                  (__index_type *)
                  ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                          super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x40U)) {
                operator_delete((void *)result.m_variant.
                                        super__Variant_base<bilingual_str,_std::monostate>.
                                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                        super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                        _M_u._48_8_,
                                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate>._64_8_ +
                                1);
              }
              if ((void *)CONCAT71(result.m_variant.
                                   super__Variant_base<bilingual_str,_std::monostate>.
                                   super__Move_assign_alias<bilingual_str,_std::monostate>.
                                   super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                   super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                   super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                   super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                   _17_7_,result.m_variant.
                                          super__Variant_base<bilingual_str,_std::monostate>.
                                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                          super__Variant_storage_alias<bilingual_str,_std::monostate>
                                          ._M_u._M_first._M_storage._M_storage[0x10]) !=
                  (void *)((long)&result.m_variant.
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x20U)) {
                operator_delete((void *)CONCAT71(result.m_variant.
                                                 super__Variant_base<bilingual_str,_std::monostate>.
                                                 super__Move_assign_alias<bilingual_str,_std::monostate>
                                                 .
                                                 super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                 .
                                                 super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                 .
                                                 super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                 .
                                                 super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                 ._M_u._17_7_,
                                                 result.m_variant.
                                                 super__Variant_base<bilingual_str,_std::monostate>.
                                                 super__Move_assign_alias<bilingual_str,_std::monostate>
                                                 .
                                                 super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                 .
                                                 super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                 .
                                                 super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                 .
                                                 super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                 ._M_u._M_first._M_storage._M_storage[0x10]),
                                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                _32_8_ + 1);
              }
              if (local_7e0[0] != local_7d0) {
                operator_delete(local_7e0[0],local_7d0[0] + 1);
              }
              if (local_800[0] != local_7f0) {
                operator_delete(local_800[0],local_7f0[0] + 1);
              }
              local_850._0_4_ = package_state.super_ValidationState<PackageValidationResult>.m_mode;
              local_850._4_4_ =
                   package_state.super_ValidationState<PackageValidationResult>.m_result;
              local_848 = local_838;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_848,
                         package_state.super_ValidationState<PackageValidationResult>.
                         m_reject_reason._M_dataplus._M_p,
                         package_state.super_ValidationState<PackageValidationResult>.
                         m_reject_reason._M_dataplus._M_p +
                         package_state.super_ValidationState<PackageValidationResult>.
                         m_reject_reason._M_string_length);
              local_828[0] = local_818;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_828,
                         package_state.super_ValidationState<PackageValidationResult>.
                         m_debug_message._M_dataplus._M_p,
                         package_state.super_ValidationState<PackageValidationResult>.
                         m_debug_message._M_dataplus._M_p +
                         package_state.super_ValidationState<PackageValidationResult>.
                         m_debug_message._M_string_length);
              state_08.super_ValidationState<PackageValidationResult>.m_result._3_1_ = local_9d1;
              state_08.super_ValidationState<PackageValidationResult>._0_7_ = uStack_9d8;
              state_08.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
              _M_p = (pointer)this;
              state_08.super_ValidationState<PackageValidationResult>.m_reject_reason.
              _M_string_length._0_4_ = (uint)__range1;
              state_08.super_ValidationState<PackageValidationResult>.m_reject_reason.
              _M_string_length._4_4_ = __range1._4_4_;
              state_08.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
              _M_allocated_capacity = (size_type)local_9c0;
              state_08.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_
                   = args;
              state_08.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus.
              _M_p._0_4_ = local_9b0;
              state_08.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus.
              _M_p._4_4_ = uStack_9ac;
              state_08.super_ValidationState<PackageValidationResult>.m_debug_message.
              _M_string_length = (size_type)__return_storage_ptr__;
              state_08.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
              _M_allocated_capacity = (size_type)txns;
              state_08.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_
                   = local_998;
              PackageMempoolAcceptResult::PackageMempoolAcceptResult
                        (__return_storage_ptr__,state_08,
                         (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                          *)local_850);
              pWVar38 = extraout_RDX_05;
              if (local_828[0] != local_818) {
                operator_delete(local_828[0],local_818[0] + 1);
                pWVar38 = extraout_RDX_06;
              }
              if (local_848 != local_838) {
                pbVar44 = (byte *)((long)&local_838[0]->_M_color + 1);
                uVar43 = local_848;
LAB_00b0d579:
                operator_delete((void *)uVar43,(ulong)pbVar44);
                pWVar38 = extraout_RDX_10;
              }
            }
            if (!bVar20) goto LAB_00b0e75e;
            pWVar27 = pWVar27 + 1;
          } while (pWVar27 != pWVar25);
        }
        pWVar27 = local_968.
                  super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pWVar25 = local_968.
                  super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (args->m_test_accept == true) {
          local_898._0_4_ = package_state.super_ValidationState<PackageValidationResult>.m_mode;
          local_898._4_4_ = package_state.super_ValidationState<PackageValidationResult>.m_result;
          plVar49 = local_880;
          local_890 = plVar49;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_890,
                     package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                     _M_dataplus._M_p,
                     package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                     _M_dataplus._M_p +
                     package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                     _M_string_length);
          local_870[0] = local_860;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_870,
                     package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                     _M_dataplus._M_p,
                     package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                     _M_dataplus._M_p +
                     package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                     _M_string_length);
          state_09.super_ValidationState<PackageValidationResult>.m_result._3_1_ = local_9d1;
          state_09.super_ValidationState<PackageValidationResult>._0_7_ = uStack_9d8;
          state_09.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
               (pointer)this;
          state_09.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length.
          _0_4_ = (uint)__range1;
          state_09.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length.
          _4_4_ = __range1._4_4_;
          state_09.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
          _M_allocated_capacity = (size_type)local_9c0;
          state_09.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ =
               args;
          state_09.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p.
          _0_4_ = local_9b0;
          state_09.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p.
          _4_4_ = uStack_9ac;
          state_09.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
               (size_type)__return_storage_ptr__;
          state_09.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
          _M_allocated_capacity = (size_type)txns;
          state_09.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
               local_998;
          PackageMempoolAcceptResult::PackageMempoolAcceptResult
                    (__return_storage_ptr__,state_09,
                     (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                      *)local_898);
          plVar46 = local_890;
          if (local_870[0] != local_860) {
            operator_delete(local_870[0],local_860[0] + 1);
            plVar46 = local_890;
          }
        }
        else {
          limits = (string *)0x8e38e38e38e38e39;
          lVar28 = ((long)local_968.
                          super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_968.
                          super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 6) * -0x71c71c71c71c71c7 >> 2
          ;
          pWVar41 = local_968.
                    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar37 = result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                   super__Move_assign_alias<bilingual_str,_std::monostate>.
                   super__Copy_assign_alias<bilingual_str,_std::monostate>.
                   super__Move_ctor_alias<bilingual_str,_std::monostate>.
                   super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                   super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_;
          if (0 < lVar28) {
            lVar28 = lVar28 + 1;
            pWVar41 = local_968.
                      super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                      ._M_impl.super__Vector_impl_data._M_start + 2;
            do {
              pWVar48 = pWVar41;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._36_4_ =
                   (undefined4)((ulong)lVar37 >> 0x20);
              peVar7 = ((pWVar48[-2].m_ptx)->
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0] = '\0';
              uVar43 = *(undefined8 *)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
              ;
              uVar45 = *(undefined8 *)
                        ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
              uVar15 = *(undefined8 *)
                        ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10
                        );
              uVar16 = *(undefined8 *)
                        ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18
                        );
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                   (undefined7)uVar15;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x18] = (uchar)((ulong)uVar15 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                   (undefined7)uVar16;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._33_3_ =
                   (undefined3)((ulong)lVar37 >> 8);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x20] = (uchar)((ulong)uVar16 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                   (undefined7)uVar43;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[8] = (uchar)((ulong)uVar43 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._9_3_ =
                   (undefined3)uVar45;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                   (undefined4)((ulong)uVar45 >> 0x18);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x10] = (uchar)((ulong)uVar45 >> 0x38);
              bVar20 = CTxMemPool::exists(this->m_pool,(GenTxid *)&result);
              lVar30 = CONCAT71(extraout_var,bVar20);
              if (bVar20) {
                pWVar48 = pWVar48 + -2;
                pWVar38 = extraout_RDX_11;
                lVar37 = CONCAT44(result.m_variant.
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                  _36_4_,result.m_variant.
                                         super__Variant_base<bilingual_str,_std::monostate>.
                                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                         super__Variant_storage_alias<bilingual_str,_std::monostate>
                                         ._M_u._32_4_);
                goto LAB_00b0d960;
              }
              peVar7 = ((pWVar48[-1].m_ptx)->
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0] = '\0';
              uVar43 = *(undefined8 *)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
              ;
              uVar45 = *(undefined8 *)
                        ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
              uVar15 = *(undefined8 *)
                        ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10
                        );
              uVar16 = *(undefined8 *)
                        ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18
                        );
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                   (undefined7)uVar15;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x18] = (uchar)((ulong)uVar15 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                   (undefined7)uVar16;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x20] = (uchar)((ulong)uVar16 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                   (undefined7)uVar43;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[8] = (uchar)((ulong)uVar43 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._9_3_ =
                   (undefined3)uVar45;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                   (undefined4)((ulong)uVar45 >> 0x18);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x10] = (uchar)((ulong)uVar45 >> 0x38);
              bVar20 = CTxMemPool::exists(this->m_pool,(GenTxid *)&result);
              lVar30 = CONCAT71(extraout_var_00,bVar20);
              if (bVar20) {
                pWVar48 = pWVar48 + -1;
                pWVar38 = extraout_RDX_12;
                lVar37 = CONCAT44(result.m_variant.
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                  _36_4_,result.m_variant.
                                         super__Variant_base<bilingual_str,_std::monostate>.
                                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                         super__Variant_storage_alias<bilingual_str,_std::monostate>
                                         ._M_u._32_4_);
                goto LAB_00b0d960;
              }
              peVar7 = (pWVar48->m_ptx->
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0] = '\0';
              uVar43 = *(undefined8 *)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
              ;
              uVar45 = *(undefined8 *)
                        ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
              uVar15 = *(undefined8 *)
                        ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10
                        );
              uVar16 = *(undefined8 *)
                        ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18
                        );
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                   (undefined7)uVar15;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x18] = (uchar)((ulong)uVar15 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                   (undefined7)uVar16;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x20] = (uchar)((ulong)uVar16 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                   (undefined7)uVar43;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[8] = (uchar)((ulong)uVar43 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._9_3_ =
                   (undefined3)uVar45;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                   (undefined4)((ulong)uVar45 >> 0x18);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x10] = (uchar)((ulong)uVar45 >> 0x38);
              bVar20 = CTxMemPool::exists(this->m_pool,(GenTxid *)&result);
              lVar30 = CONCAT71(extraout_var_01,bVar20);
              pWVar38 = extraout_RDX_13;
              lVar37 = CONCAT44(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                _36_4_,result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._32_4_);
              if (bVar20) goto LAB_00b0d960;
              peVar7 = ((pWVar48[1].m_ptx)->
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0] = '\0';
              uVar43 = *(undefined8 *)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
              ;
              uVar45 = *(undefined8 *)
                        ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
              uVar15 = *(undefined8 *)
                        ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10
                        );
              uVar16 = *(undefined8 *)
                        ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18
                        );
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                   (undefined7)uVar15;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x18] = (uchar)((ulong)uVar15 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                   (undefined7)uVar16;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x20] = (uchar)((ulong)uVar16 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                   (undefined7)uVar43;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[8] = (uchar)((ulong)uVar43 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._9_3_ =
                   (undefined3)uVar45;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                   (undefined4)((ulong)uVar45 >> 0x18);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x10] = (uchar)((ulong)uVar45 >> 0x38);
              bVar20 = CTxMemPool::exists(this->m_pool,(GenTxid *)&result);
              lVar37 = CONCAT44(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                _36_4_,result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._32_4_);
              lVar30 = CONCAT71(extraout_var_02,bVar20);
              pWVar38 = extraout_RDX_14;
              if (bVar20) {
                pWVar48 = pWVar48 + 1;
                goto LAB_00b0d960;
              }
              lVar28 = lVar28 + -1;
              pWVar41 = pWVar48 + 4;
            } while (1 < lVar28);
            pWVar41 = pWVar48 + 2;
          }
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._36_4_ =
               (undefined4)((ulong)lVar37 >> 0x20);
          limits = (string *)0x8e38e38e38e38e39;
          lVar30 = ((long)pWVar27 - (long)pWVar41 >> 6) * -0x71c71c71c71c71c7;
          if (lVar30 == 1) {
LAB_00b0d920:
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._36_4_ =
                 (undefined4)((ulong)lVar37 >> 0x20);
            peVar7 = (pWVar41->m_ptx->
                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
            _M_storage[0] = '\0';
            uVar43 = *(undefined8 *)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
            uVar45 = *(undefined8 *)
                      ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
            uVar15 = *(undefined8 *)
                      ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
            uVar16 = *(undefined8 *)
                      ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                 (undefined7)uVar43;
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
            _M_storage[8] = (uchar)((ulong)uVar43 >> 0x38);
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._9_3_ =
                 (undefined3)uVar45;
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                 (undefined4)((ulong)uVar45 >> 0x18);
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
            _M_storage[0x10] = (uchar)((ulong)uVar45 >> 0x38);
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                 (undefined7)uVar15;
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
            _M_storage[0x18] = (uchar)((ulong)uVar15 >> 0x38);
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                 (undefined7)uVar16;
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._33_3_ =
                 (undefined3)((ulong)lVar37 >> 8);
            result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
            super__Move_assign_alias<bilingual_str,_std::monostate>.
            super__Copy_assign_alias<bilingual_str,_std::monostate>.
            super__Move_ctor_alias<bilingual_str,_std::monostate>.
            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
            _M_storage[0x20] = (uchar)((ulong)uVar16 >> 0x38);
            bVar20 = CTxMemPool::exists(this->m_pool,(GenTxid *)&result);
            lVar30 = CONCAT71(extraout_var_05,bVar20);
            pWVar38 = extraout_RDX_17;
            pWVar48 = pWVar41;
            if (!bVar20) {
              pWVar48 = pWVar27;
            }
LAB_00b0d954:
            lVar37 = CONCAT44(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                              _36_4_,result.m_variant.
                                     super__Variant_base<bilingual_str,_std::monostate>.
                                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                     _M_u._32_4_);
          }
          else {
            if (lVar30 == 2) {
LAB_00b0d81f:
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._36_4_ =
                   (undefined4)((ulong)lVar37 >> 0x20);
              peVar7 = (pWVar41->m_ptx->
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0] = '\0';
              uVar43 = *(undefined8 *)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
              ;
              uVar45 = *(undefined8 *)
                        ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
              uVar15 = *(undefined8 *)
                        ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10
                        );
              uVar16 = *(undefined8 *)
                        ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18
                        );
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                   (undefined7)uVar43;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[8] = (uchar)((ulong)uVar43 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._9_3_ =
                   (undefined3)uVar45;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                   (undefined4)((ulong)uVar45 >> 0x18);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x10] = (uchar)((ulong)uVar45 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                   (undefined7)uVar15;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x18] = (uchar)((ulong)uVar15 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                   (undefined7)uVar16;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._33_3_ =
                   (undefined3)((ulong)lVar37 >> 8);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x20] = (uchar)((ulong)uVar16 >> 0x38);
              bVar20 = CTxMemPool::exists(this->m_pool,(GenTxid *)&result);
              lVar37 = CONCAT44(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                _36_4_,result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._32_4_);
              lVar30 = CONCAT71(extraout_var_04,bVar20);
              pWVar38 = extraout_RDX_16;
              pWVar48 = pWVar41;
              if (!bVar20) {
                pWVar41 = pWVar41 + 1;
                goto LAB_00b0d920;
              }
              goto LAB_00b0d954;
            }
            pWVar48 = pWVar27;
            if (lVar30 == 3) {
              peVar7 = (pWVar41->m_ptx->
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0] = '\0';
              uVar43 = *(undefined8 *)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
              ;
              uVar45 = *(undefined8 *)
                        ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
              uVar15 = *(undefined8 *)
                        ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10
                        );
              uVar16 = *(undefined8 *)
                        ((long)(peVar7->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18
                        );
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                   (undefined7)uVar43;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[8] = (uchar)((ulong)uVar43 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._9_3_ =
                   (undefined3)uVar45;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                   (undefined4)((ulong)uVar45 >> 0x18);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x10] = (uchar)((ulong)uVar45 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                   (undefined7)uVar15;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x18] = (uchar)((ulong)uVar15 >> 0x38);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                   (undefined7)uVar16;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._33_3_ =
                   (undefined3)((ulong)lVar37 >> 8);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x20] = (uchar)((ulong)uVar16 >> 0x38);
              bVar20 = CTxMemPool::exists(this->m_pool,(GenTxid *)&result);
              lVar37 = CONCAT44(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                _36_4_,result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._32_4_);
              lVar30 = CONCAT71(extraout_var_03,bVar20);
              pWVar38 = extraout_RDX_15;
              pWVar48 = pWVar41;
              if (!bVar20) {
                pWVar41 = pWVar41 + 1;
                goto LAB_00b0d81f;
              }
              goto LAB_00b0d954;
            }
          }
LAB_00b0d960:
          result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
          super__Move_assign_alias<bilingual_str,_std::monostate>.
          super__Copy_assign_alias<bilingual_str,_std::monostate>.
          super__Move_ctor_alias<bilingual_str,_std::monostate>.
          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
          super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_ = lVar37;
          if (pWVar48 != pWVar27) {
            __assert_fail("std::all_of(workspaces.cbegin(), workspaces.cend(), [this](const auto& ws){ return !m_pool.exists(GenTxid::Txid(ws.m_ptx->GetHash())); })"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                          ,0x547,
                          "bool (anonymous namespace)::MemPoolAccept::SubmitPackage(const ATMPArgs &, std::vector<Workspace> &, PackageValidationState &, std::map<uint256, MempoolAcceptResult> &)"
                         );
          }
          uVar34 = (undefined7)((ulong)lVar30 >> 8);
          if (pWVar25 == pWVar27) {
            __range1._0_4_ = (uint)CONCAT71(uVar34,1);
          }
          else {
            pptVar4 = &effective_feerate_wtxids_1.
                       super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            __range1._0_4_ = (uint)CONCAT71(uVar34,1);
            do {
              bVar20 = ConsensusScriptChecks(this,(ATMPArgs *)pWVar25,pWVar38);
              if (!bVar20) {
                peVar7 = (pWVar25->m_ptx->
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                err.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_payload._M_value._M_dataplus._M_p =
                     (_Alloc_hider)
                     *(undefined8 *)&(pWVar25->m_state).super_ValidationState<TxValidationResult>;
                err.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_payload._M_value._M_string_length =
                     (long)&err.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload + 0x18;
                pcVar10 = (pWVar25->m_state).super_ValidationState<TxValidationResult>.
                          m_reject_reason._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)
                           ((long)&err.
                                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                   ._M_payload.
                                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                   .
                                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   ._M_payload + 8),pcVar10,
                           pcVar10 + (pWVar25->m_state).super_ValidationState<TxValidationResult>.
                                     m_reject_reason._M_string_length);
                local_708 = (string  [8])(local_700._M_local_buf + 8);
                pcVar10 = (pWVar25->m_state).super_ValidationState<TxValidationResult>.
                          m_debug_message._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          (local_708,pcVar10,
                           pcVar10 + (pWVar25->m_state).super_ValidationState<TxValidationResult>.
                                     m_debug_message._M_string_length);
                state_11.super_ValidationState<TxValidationResult>.m_result._3_1_ = local_9d1;
                state_11.super_ValidationState<TxValidationResult>._0_7_ = uStack_9d8;
                state_11.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p
                     = (pointer)this;
                state_11.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length.
                _0_4_ = (uint)__range1;
                state_11.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length.
                _4_4_ = __range1._4_4_;
                state_11.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
                _M_allocated_capacity = (size_type)pWVar27;
                state_11.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ =
                     args;
                state_11.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p.
                _0_4_ = local_9b0;
                state_11.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p.
                _4_4_ = uStack_9ac;
                state_11.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length
                     = (size_type)__return_storage_ptr__;
                state_11.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
                _M_allocated_capacity = (size_type)txns;
                state_11.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
                     local_998;
                MempoolAcceptResult::Failure((MempoolAcceptResult *)&result,state_11);
                std::
                _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                          ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                            *)&results,&peVar7->m_witness_hash,(MempoolAcceptResult *)&result);
                if (local_2e8 == true) {
                  local_2e8 = false;
                  pvVar17 = (void *)CONCAT71(local_300._1_7_,local_300._0_1_);
                  if (pvVar17 != (void *)0x0) {
                    operator_delete(pvVar17,(long)local_300._M_value.
                                                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)pvVar17);
                  }
                }
                std::__cxx11::
                _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ::_M_clear((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            *)local_348);
                if ((__index_type *)
                    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._48_8_ !=
                    (__index_type *)
                    ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                            super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x40U)) {
                  operator_delete((void *)result.m_variant.
                                          super__Variant_base<bilingual_str,_std::monostate>.
                                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                          super__Variant_storage_alias<bilingual_str,_std::monostate>
                                          ._M_u._48_8_,
                                  result.m_variant.
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate>._64_8_
                                  + 1);
                }
                if ((void *)CONCAT71(result.m_variant.
                                     super__Variant_base<bilingual_str,_std::monostate>.
                                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                     _M_u._17_7_,
                                     result.m_variant.
                                     super__Variant_base<bilingual_str,_std::monostate>.
                                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                     _M_u._M_first._M_storage._M_storage[0x10]) !=
                    (void *)((long)&result.m_variant.
                                    super__Variant_base<bilingual_str,_std::monostate>.
                                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x20U))
                {
                  operator_delete((void *)CONCAT71(result.m_variant.
                                                                                                      
                                                  super__Variant_base<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                  ._M_u._17_7_,
                                                  result.m_variant.
                                                  super__Variant_base<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                  ._M_u._M_first._M_storage._M_storage[0x10]),
                                  result.m_variant.
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                  _32_8_ + 1);
                }
                if (local_708 != (string  [8])(local_700._M_local_buf + 8)) {
                  operator_delete((void *)local_708,local_700._8_8_ + 1);
                }
                if ((undefined1 *)
                    err.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._M_payload._M_value._M_string_length !=
                    (undefined1 *)
                    ((long)&err.
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            ._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload + 0x18)) {
                  operator_delete((void *)err.
                                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                          ._M_payload.
                                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                          .
                                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                          ._M_payload._M_value._M_string_length,
                                  err.
                                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                                  ._M_payload.
                                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                                  .
                                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  ._M_payload._24_8_ + 1);
                }
                base_blob<256u>::ToString_abi_cxx11_
                          ((string *)&__dnew_1,
                           &((pWVar25->m_ptx->
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr)->hash);
                tinyformat::format<std::__cxx11::string>
                          ((string *)&result,
                           (tinyformat *)
                           "BUG! PolicyScriptChecks succeeded but ConsensusScriptChecks failed: %s",
                           (char *)&__dnew_1,limits);
                effective_feerate_wtxids_1.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                effective_feerate_wtxids_1.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                effective_feerate_wtxids_1.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)pptVar4;
                ValidationState<PackageValidationResult>::Invalid
                          (&package_state.super_ValidationState<PackageValidationResult>,
                           PCKG_MEMPOOL_ERROR,(string *)&result,
                           (string *)&effective_feerate_wtxids_1);
                if (effective_feerate_wtxids_1.
                    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)pptVar4) {
                  operator_delete(effective_feerate_wtxids_1.
                                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  CONCAT71(effective_feerate_wtxids_1.
                                           super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                           effective_feerate_wtxids_1.
                                           super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_)
                                  + 1);
                }
                if ((void *)CONCAT71(result.m_variant.
                                     super__Variant_base<bilingual_str,_std::monostate>.
                                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                     _M_u._1_7_,
                                     result.m_variant.
                                     super__Variant_base<bilingual_str,_std::monostate>.
                                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                     _M_u._M_first._M_storage._M_storage[0]) !=
                    (void *)((long)&result.m_variant.
                                    super__Variant_base<bilingual_str,_std::monostate>.
                                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x10U))
                {
                  operator_delete((void *)CONCAT71(result.m_variant.
                                                                                                      
                                                  super__Variant_base<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                  ._M_u._1_7_,
                                                  result.m_variant.
                                                  super__Variant_base<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                  ._M_u._M_first._M_storage._M_storage[0]),
                                  CONCAT71(result.m_variant.
                                           super__Variant_base<bilingual_str,_std::monostate>.
                                           super__Move_assign_alias<bilingual_str,_std::monostate>.
                                           super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                           super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                           super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                           super__Variant_storage_alias<bilingual_str,_std::monostate>
                                           ._M_u._17_7_,
                                           result.m_variant.
                                           super__Variant_base<bilingual_str,_std::monostate>.
                                           super__Move_assign_alias<bilingual_str,_std::monostate>.
                                           super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                           super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                           super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                           super__Variant_storage_alias<bilingual_str,_std::monostate>
                                           ._M_u._M_first._M_storage._M_storage[0x10]) + 1);
                }
                if ((undefined1 *)__dnew_1 != auStack_a0 + 8) {
                  operator_delete((void *)__dnew_1,(ulong)(auStack_a0._8_8_ + 1));
                }
                __range1._0_4_ = 0;
              }
              limits = (string *)&(this->m_pool->m_opts).limits;
              CTxMemPool::CalculateMemPoolAncestors
                        ((Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                          *)&__dnew_1,this->m_pool,
                         (pWVar25->m_entry)._M_t.
                         super___uniq_ptr_impl<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_CTxMemPoolEntry_*,_std::default_delete<CTxMemPoolEntry>_>
                         .super__Head_base<0UL,_CTxMemPoolEntry_*,_false>._M_head_impl,
                         (Limits *)limits,true);
              if (local_68 != '\x01') {
                peVar7 = (pWVar25->m_ptx->
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                local_f0 = *(undefined1 (*) [8])
                            &(pWVar25->m_state).super_ValidationState<TxValidationResult>;
                local_e8 = local_e0._M_local_buf + 8;
                pcVar10 = (pWVar25->m_state).super_ValidationState<TxValidationResult>.
                          m_reject_reason._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_e8,pcVar10,
                           pcVar10 + (pWVar25->m_state).super_ValidationState<TxValidationResult>.
                                     m_reject_reason._M_string_length);
                local_c8[0] = local_b8;
                pcVar10 = (pWVar25->m_state).super_ValidationState<TxValidationResult>.
                          m_debug_message._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_c8,pcVar10,
                           pcVar10 + (pWVar25->m_state).super_ValidationState<TxValidationResult>.
                                     m_debug_message._M_string_length);
                state_12.super_ValidationState<TxValidationResult>.m_result._3_1_ = local_9d1;
                state_12.super_ValidationState<TxValidationResult>._0_7_ = uStack_9d8;
                state_12.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p
                     = (pointer)this;
                state_12.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length.
                _0_4_ = (uint)__range1;
                state_12.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length.
                _4_4_ = __range1._4_4_;
                state_12.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
                _M_allocated_capacity = (size_type)pWVar27;
                state_12.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ =
                     args;
                state_12.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p.
                _0_4_ = local_9b0;
                state_12.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p.
                _4_4_ = uStack_9ac;
                state_12.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length
                     = (size_type)__return_storage_ptr__;
                state_12.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
                _M_allocated_capacity = (size_type)txns;
                state_12.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
                     local_998;
                MempoolAcceptResult::Failure((MempoolAcceptResult *)&result,state_12);
                std::
                _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                          ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                            *)&results,&peVar7->m_witness_hash,(MempoolAcceptResult *)&result);
                if (local_2e8 == true) {
                  local_2e8 = false;
                  pvVar17 = (void *)CONCAT71(local_300._1_7_,local_300._0_1_);
                  if (pvVar17 != (void *)0x0) {
                    operator_delete(pvVar17,(long)local_300._M_value.
                                                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)pvVar17);
                  }
                }
                std::__cxx11::
                _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ::_M_clear((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            *)local_348);
                if ((__index_type *)
                    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._48_8_ !=
                    (__index_type *)
                    ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                            super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x40U)) {
                  operator_delete((void *)result.m_variant.
                                          super__Variant_base<bilingual_str,_std::monostate>.
                                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                          super__Variant_storage_alias<bilingual_str,_std::monostate>
                                          ._M_u._48_8_,
                                  result.m_variant.
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate>._64_8_
                                  + 1);
                }
                if ((void *)CONCAT71(result.m_variant.
                                     super__Variant_base<bilingual_str,_std::monostate>.
                                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                     _M_u._17_7_,
                                     result.m_variant.
                                     super__Variant_base<bilingual_str,_std::monostate>.
                                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                     _M_u._M_first._M_storage._M_storage[0x10]) !=
                    (void *)((long)&result.m_variant.
                                    super__Variant_base<bilingual_str,_std::monostate>.
                                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x20U))
                {
                  operator_delete((void *)CONCAT71(result.m_variant.
                                                                                                      
                                                  super__Variant_base<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                  ._M_u._17_7_,
                                                  result.m_variant.
                                                  super__Variant_base<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                  ._M_u._M_first._M_storage._M_storage[0x10]),
                                  result.m_variant.
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                  _32_8_ + 1);
                }
                if (local_c8[0] != local_b8) {
                  operator_delete(local_c8[0],local_b8[0] + 1);
                }
                if (local_e8 != local_e0._M_local_buf + 8) {
                  operator_delete(local_e8,local_e0._8_8_ + 1);
                }
                base_blob<256u>::ToString_abi_cxx11_
                          ((string *)&effective_feerate_wtxids_1,
                           &((pWVar25->m_ptx->
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr)->hash);
                tinyformat::format<std::__cxx11::string>
                          ((string *)&result,
                           (tinyformat *)
                           "BUG! Mempool ancestors or descendants were underestimated: %s",
                           (char *)&effective_feerate_wtxids_1,limits);
                local_100._M_local_buf[0] = '\0';
                limits = (string *)&parent_feerate;
                parent_feerate.nSatoshisPerK = (CAmount)&local_100;
                ValidationState<PackageValidationResult>::Invalid
                          (&package_state.super_ValidationState<PackageValidationResult>,
                           PCKG_MEMPOOL_ERROR,(string *)&result,limits);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)parent_feerate.nSatoshisPerK != &local_100) {
                  operator_delete((void *)parent_feerate.nSatoshisPerK,
                                  CONCAT71(local_100._M_allocated_capacity._1_7_,
                                           local_100._M_local_buf[0]) + 1);
                }
                if ((void *)CONCAT71(result.m_variant.
                                     super__Variant_base<bilingual_str,_std::monostate>.
                                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                     _M_u._1_7_,
                                     result.m_variant.
                                     super__Variant_base<bilingual_str,_std::monostate>.
                                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                     _M_u._M_first._M_storage._M_storage[0]) !=
                    (void *)((long)&result.m_variant.
                                    super__Variant_base<bilingual_str,_std::monostate>.
                                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x10U))
                {
                  operator_delete((void *)CONCAT71(result.m_variant.
                                                                                                      
                                                  super__Variant_base<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                  ._M_u._1_7_,
                                                  result.m_variant.
                                                  super__Variant_base<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                  ._M_u._M_first._M_storage._M_storage[0]),
                                  CONCAT71(result.m_variant.
                                           super__Variant_base<bilingual_str,_std::monostate>.
                                           super__Move_assign_alias<bilingual_str,_std::monostate>.
                                           super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                           super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                           super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                           super__Variant_storage_alias<bilingual_str,_std::monostate>
                                           ._M_u._17_7_,
                                           result.m_variant.
                                           super__Variant_base<bilingual_str,_std::monostate>.
                                           super__Move_assign_alias<bilingual_str,_std::monostate>.
                                           super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                           super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                           super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                           super__Variant_storage_alias<bilingual_str,_std::monostate>
                                           ._M_u._M_first._M_storage._M_storage[0x10]) + 1);
                }
                if (effective_feerate_wtxids_1.
                    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)pptVar4) {
                  operator_delete(effective_feerate_wtxids_1.
                                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  CONCAT71(effective_feerate_wtxids_1.
                                           super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                           effective_feerate_wtxids_1.
                                           super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_)
                                  + 1);
                }
                __range1._0_4_ = 0;
              }
              util::
              Result<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,CompareIteratorByHash,std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>>
              ::
              value_or<std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,CompareIteratorByHash,std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>&>
                        ((T *)&result,
                         (_Variant_storage<false,_bilingual_str,_std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                          *)&__dnew_1,&pWVar25->m_ancestors);
              std::_Rb_tree<$270907ca$>::clear(&(pWVar25->m_ancestors)._M_t);
              p_Var9 = (_Base_ptr)
                       CONCAT71(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                _17_7_,result.m_variant.
                                       super__Variant_base<bilingual_str,_std::monostate>.
                                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                       super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                       _M_u._M_first._M_storage._M_storage[0x10]);
              if (p_Var9 != (_Base_ptr)0x0) {
                (pWVar25->m_ancestors)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                     result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_4_;
                (pWVar25->m_ancestors)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                     p_Var9;
                (pWVar25->m_ancestors)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                     (_Base_ptr)
                     CONCAT71(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                              _25_7_,result.m_variant.
                                     super__Variant_base<bilingual_str,_std::monostate>.
                                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                     _M_u._M_first._M_storage._M_storage[0x18]);
                (pWVar25->m_ancestors)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                     (_Base_ptr)
                     result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_;
                p_Var9->_M_parent =
                     &(pWVar25->m_ancestors)._M_t._M_impl.super__Rb_tree_header._M_header;
                (pWVar25->m_ancestors)._M_t._M_impl.super__Rb_tree_header._M_node_count =
                     result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                     super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._40_8_;
                limits = (string *)0x0;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[0x10] = '\0';
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ = 0;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_ =
                     (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                            super__Copy_ctor_alias<bilingual_str,_std::monostate> + 8;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage
                ._M_storage[0x18] =
                     (uchar)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                            super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_;
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                     (undefined7)
                     ((ulong)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                             super__Move_assign_alias<bilingual_str,_std::monostate>.
                             super__Copy_assign_alias<bilingual_str,_std::monostate>.
                             super__Move_ctor_alias<bilingual_str,_std::monostate>.
                             super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                             super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_
                     >> 8);
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._40_8_ = 0;
              }
              std::_Rb_tree<$270907ca$>::~_Rb_tree((_Rb_tree<_270907ca_> *)&result);
              std::__detail::__variant::
              _Variant_storage<false,_bilingual_str,_std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
              ::~_Variant_storage((_Variant_storage<false,_bilingual_str,_std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_CompareIteratorByHash,_std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>_>_>
                                   *)&__dnew_1);
              bVar20 = Finalize(this,args,pWVar25);
              pWVar38 = extraout_RDX_18;
              if (!bVar20) {
                peVar7 = (pWVar25->m_ptx->
                         super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
                local_158 = *(undefined1 (*) [8])
                             &(pWVar25->m_state).super_ValidationState<TxValidationResult>;
                local_150 = local_148._M_local_buf + 8;
                pcVar10 = (pWVar25->m_state).super_ValidationState<TxValidationResult>.
                          m_reject_reason._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_150,pcVar10,
                           pcVar10 + (pWVar25->m_state).super_ValidationState<TxValidationResult>.
                                     m_reject_reason._M_string_length);
                local_130[0] = local_120;
                pcVar10 = (pWVar25->m_state).super_ValidationState<TxValidationResult>.
                          m_debug_message._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_130,pcVar10,
                           pcVar10 + (pWVar25->m_state).super_ValidationState<TxValidationResult>.
                                     m_debug_message._M_string_length);
                state_13.super_ValidationState<TxValidationResult>.m_result._3_1_ = local_9d1;
                state_13.super_ValidationState<TxValidationResult>._0_7_ = uStack_9d8;
                state_13.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p
                     = (pointer)this;
                state_13.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length.
                _0_4_ = (uint)__range1;
                state_13.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length.
                _4_4_ = __range1._4_4_;
                state_13.super_ValidationState<TxValidationResult>.m_reject_reason.field_2.
                _M_allocated_capacity = (size_type)pWVar27;
                state_13.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._8_8_ =
                     args;
                state_13.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p.
                _0_4_ = local_9b0;
                state_13.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p.
                _4_4_ = uStack_9ac;
                state_13.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length
                     = (size_type)__return_storage_ptr__;
                state_13.super_ValidationState<TxValidationResult>.m_debug_message.field_2.
                _M_allocated_capacity = (size_type)txns;
                state_13.super_ValidationState<TxValidationResult>.m_debug_message.field_2._8_8_ =
                     local_998;
                MempoolAcceptResult::Failure((MempoolAcceptResult *)&result,state_13);
                std::
                _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                          ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                            *)&results,&peVar7->m_witness_hash,(MempoolAcceptResult *)&result);
                if (local_2e8 == true) {
                  local_2e8 = false;
                  pvVar17 = (void *)CONCAT71(local_300._1_7_,local_300._0_1_);
                  if (pvVar17 != (void *)0x0) {
                    operator_delete(pvVar17,(long)local_300._M_value.
                                                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)pvVar17);
                  }
                }
                std::__cxx11::
                _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                ::_M_clear((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                            *)local_348);
                if ((__index_type *)
                    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._48_8_ !=
                    (__index_type *)
                    ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                            super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x40U)) {
                  operator_delete((void *)result.m_variant.
                                          super__Variant_base<bilingual_str,_std::monostate>.
                                          super__Move_assign_alias<bilingual_str,_std::monostate>.
                                          super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                          super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                          super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                          super__Variant_storage_alias<bilingual_str,_std::monostate>
                                          ._M_u._48_8_,
                                  result.m_variant.
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate>._64_8_
                                  + 1);
                }
                if ((void *)CONCAT71(result.m_variant.
                                     super__Variant_base<bilingual_str,_std::monostate>.
                                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                     _M_u._17_7_,
                                     result.m_variant.
                                     super__Variant_base<bilingual_str,_std::monostate>.
                                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                     _M_u._M_first._M_storage._M_storage[0x10]) !=
                    (void *)((long)&result.m_variant.
                                    super__Variant_base<bilingual_str,_std::monostate>.
                                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x20U))
                {
                  operator_delete((void *)CONCAT71(result.m_variant.
                                                                                                      
                                                  super__Variant_base<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                  ._M_u._17_7_,
                                                  result.m_variant.
                                                  super__Variant_base<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                  ._M_u._M_first._M_storage._M_storage[0x10]),
                                  result.m_variant.
                                  super__Variant_base<bilingual_str,_std::monostate>.
                                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                  _32_8_ + 1);
                }
                if (local_130[0] != local_120) {
                  operator_delete(local_130[0],local_120[0] + 1);
                }
                if (local_150 != local_148._M_local_buf + 8) {
                  operator_delete(local_150,local_148._8_8_ + 1);
                }
                base_blob<256u>::ToString_abi_cxx11_
                          ((string *)&__dnew_1,
                           &((pWVar25->m_ptx->
                             super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr)->hash);
                tinyformat::format<std::__cxx11::string>
                          ((string *)&result,(tinyformat *)"BUG! Adding to mempool failed: %s",
                           (char *)&__dnew_1,limits);
                effective_feerate_wtxids_1.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                effective_feerate_wtxids_1.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
                limits = (string *)&effective_feerate_wtxids_1;
                effective_feerate_wtxids_1.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_start = (pointer)pptVar4;
                ValidationState<PackageValidationResult>::Invalid
                          (&package_state.super_ValidationState<PackageValidationResult>,
                           PCKG_MEMPOOL_ERROR,(string *)&result,limits);
                pWVar38 = extraout_RDX_19;
                if (effective_feerate_wtxids_1.
                    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)pptVar4) {
                  operator_delete(effective_feerate_wtxids_1.
                                  super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                                  CONCAT71(effective_feerate_wtxids_1.
                                           super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                           effective_feerate_wtxids_1.
                                           super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_)
                                  + 1);
                  pWVar38 = extraout_RDX_20;
                }
                if ((void *)CONCAT71(result.m_variant.
                                     super__Variant_base<bilingual_str,_std::monostate>.
                                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                     _M_u._1_7_,
                                     result.m_variant.
                                     super__Variant_base<bilingual_str,_std::monostate>.
                                     super__Move_assign_alias<bilingual_str,_std::monostate>.
                                     super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                     super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                     super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                     _M_u._M_first._M_storage._M_storage[0]) !=
                    (void *)((long)&result.m_variant.
                                    super__Variant_base<bilingual_str,_std::monostate>.
                                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x10U))
                {
                  operator_delete((void *)CONCAT71(result.m_variant.
                                                                                                      
                                                  super__Variant_base<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                  ._M_u._1_7_,
                                                  result.m_variant.
                                                  super__Variant_base<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_assign_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Move_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                                  .
                                                  super__Variant_storage_alias<bilingual_str,_std::monostate>
                                                  ._M_u._M_first._M_storage._M_storage[0]),
                                  CONCAT71(result.m_variant.
                                           super__Variant_base<bilingual_str,_std::monostate>.
                                           super__Move_assign_alias<bilingual_str,_std::monostate>.
                                           super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                           super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                           super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                           super__Variant_storage_alias<bilingual_str,_std::monostate>
                                           ._M_u._17_7_,
                                           result.m_variant.
                                           super__Variant_base<bilingual_str,_std::monostate>.
                                           super__Move_assign_alias<bilingual_str,_std::monostate>.
                                           super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                           super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                           super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                           super__Variant_storage_alias<bilingual_str,_std::monostate>
                                           ._M_u._M_first._M_storage._M_storage[0x10]) + 1);
                  pWVar38 = extraout_RDX_21;
                }
                if ((undefined1 *)__dnew_1 != auStack_a0 + 8) {
                  operator_delete((void *)__dnew_1,(ulong)(auStack_a0._8_8_ + 1));
                  pWVar38 = extraout_RDX_22;
                }
                __range1._0_4_ = 0;
              }
              pWVar25 = pWVar25 + 1;
            } while (pWVar25 != pWVar27);
          }
          pWVar27 = local_968.
                    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pWVar25 = local_968.
                    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          __dnew_1 = 0;
          auStack_a0._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          auStack_a0._8_8_ = (_Base_ptr)0x0;
          __n_00 = (pointer)(((long)local_968.
                                    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_968.
                                    super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 6) *
                            -0x71c71c71c71c71c7);
          std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
          ::reserve((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                     *)&__dnew_1,(size_type)__n_00);
          if (pWVar25 != pWVar27) {
            pWVar41 = pWVar25;
            do {
              peVar7 = (pWVar41->m_ptx->
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              uVar43 = *(undefined8 *)
                        (peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
              uVar45 = *(undefined8 *)
                        ((long)(peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                               _M_elems + 8);
              uVar15 = *(undefined8 *)
                        ((long)(peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                               _M_elems + 0x10);
              uVar16 = *(undefined8 *)
                        ((long)(peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                               _M_elems + 0x18);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x10] = (uchar)uVar15;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                   (undefined7)((ulong)uVar15 >> 8);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x18] = (uchar)uVar16;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                   (undefined7)((ulong)uVar16 >> 8);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0] = (uchar)uVar43;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                   (undefined7)((ulong)uVar43 >> 8);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_4_ =
                   (undefined4)uVar45;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                   (undefined4)((ulong)uVar45 >> 0x20);
              if (auStack_a0._0_8_ == auStack_a0._8_8_) {
                std::
                vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>::
                _M_realloc_insert<transaction_identifier<true>>
                          ((vector<transaction_identifier<true>,std::allocator<transaction_identifier<true>>>
                            *)&__dnew_1,(iterator)auStack_a0._0_8_,
                           (transaction_identifier<true> *)&result);
              }
              else {
                uVar43 = *(undefined8 *)
                          (peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
                uVar45 = *(undefined8 *)
                          ((long)(peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                                 _M_elems + 8);
                uVar15 = *(undefined8 *)
                          ((long)(peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                                 _M_elems + 0x18);
                *(undefined8 *)(auStack_a0._0_8_ + 0x10) =
                     *(undefined8 *)
                      ((long)(peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                             _M_elems + 0x10);
                *(undefined8 *)(auStack_a0._0_8_ + 0x18) = uVar15;
                *(undefined8 *)auStack_a0._0_8_ = uVar43;
                *(undefined8 *)(auStack_a0._0_8_ + 8) = uVar45;
                auStack_a0._0_8_ = auStack_a0._0_8_ + 0x20;
              }
              pWVar41 = pWVar41 + 1;
            } while (pWVar41 != pWVar27);
          }
          replaced_txns = &(this->m_subpackage).m_replaced_transactions;
          local_9a0 = txns;
          if ((this->m_subpackage).m_replaced_transactions.
              super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)replaced_txns) {
            pLVar31 = LogInstance();
            bVar20 = BCLog::Logger::WillLogCategoryLevel(pLVar31,MEMPOOL,Debug);
            if (bVar20) {
              sVar11 = (this->m_subpackage).m_replaced_transactions.
                       super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       ._M_impl._M_node._M_size;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0] = (uchar)sVar11;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                   (undefined7)(sVar11 >> 8);
              parent_feerate.nSatoshisPerK =
                   (this->m_subpackage).m_total_modified_fees -
                   (this->m_subpackage).m_conflicting_fees;
              package_feerate_1.nSatoshisPerK =
                   (this->m_subpackage).m_total_vsize -
                   (long)(int)(this->m_subpackage).m_conflicting_size;
              source_file._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
              ;
              source_file._M_len = 0x5e;
              logging_function._M_str = "SubmitPackage";
              logging_function._M_len = 0xd;
              effective_feerate_wtxids_1.
              super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
              ._M_impl.super__Vector_impl_data._M_start = __n_00;
              LogPrintFormatInternal<unsigned_long,unsigned_long,long,long>
                        (logging_function,source_file,0x580,MEMPOOL,Debug,
                         (ConstevalFormatString<4U>)0xfd790a,(unsigned_long *)&result,
                         (unsigned_long *)&effective_feerate_wtxids_1,&parent_feerate.nSatoshisPerK,
                         &package_feerate_1.nSatoshisPerK);
            }
          }
          for (; pWVar25 != pWVar27; pWVar25 = pWVar25 + 1) {
            if (args->m_package_feerates == true) {
              parent_feerate.nSatoshisPerK = (pWVar25->m_package_feerate).nSatoshisPerK;
            }
            else {
              CFeeRate::CFeeRate(&parent_feerate,&pWVar25->m_modified_fees,
                                 (uint32_t)pWVar25->m_vsize);
            }
            if (args->m_package_feerates == true) {
              std::
              vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
              vector(&effective_feerate_wtxids_1,
                     (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                      *)&__dnew_1);
            }
            else {
              peVar7 = (pWVar25->m_ptx->
                       super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              uVar43 = *(undefined8 *)
                        (peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
              uVar45 = *(undefined8 *)
                        ((long)(peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                               _M_elems + 8);
              uVar15 = *(undefined8 *)
                        ((long)(peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                               _M_elems + 0x10);
              uVar16 = *(undefined8 *)
                        ((long)(peVar7->m_witness_hash).m_wrapped.super_base_blob<256U>.m_data.
                               _M_elems + 0x18);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x10] = (uchar)uVar15;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                   (undefined7)((ulong)uVar15 >> 8);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x18] = (uchar)uVar16;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                   (undefined7)((ulong)uVar16 >> 8);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0] = (uchar)uVar43;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                   (undefined7)((ulong)uVar43 >> 8);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_4_ =
                   (undefined4)uVar45;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                   (undefined4)((ulong)uVar45 >> 0x20);
              __l_01._M_len = 1;
              __l_01._M_array = (iterator)&result;
              std::
              vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::
              vector(&effective_feerate_wtxids_1,__l_01,(allocator_type *)&package_feerate_1);
            }
            peVar7 = (pWVar25->m_ptx->
                     super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
            MempoolAcceptResult::MempoolAcceptResult
                      ((MempoolAcceptResult *)&result,replaced_txns,pWVar25->m_vsize,
                       pWVar25->m_base_fees,parent_feerate,&effective_feerate_wtxids_1);
            std::
            _Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
            ::_M_emplace_unique<transaction_identifier<true>const&,MempoolAcceptResult>
                      ((_Rb_tree<uint256,std::pair<uint256_const,MempoolAcceptResult>,std::_Select1st<std::pair<uint256_const,MempoolAcceptResult>>,std::less<uint256>,std::allocator<std::pair<uint256_const,MempoolAcceptResult>>>
                        *)&results,&peVar7->m_witness_hash,(MempoolAcceptResult *)&result);
            if (local_2e8 == true) {
              local_2e8 = false;
              pvVar17 = (void *)CONCAT71(local_300._1_7_,local_300._0_1_);
              if (pvVar17 != (void *)0x0) {
                operator_delete(pvVar17,(long)local_300._M_value.
                                              super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)pvVar17);
              }
            }
            std::__cxx11::
            _List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            ::_M_clear((_List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        *)local_348);
            if ((__index_type *)
                result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._48_8_ !=
                (__index_type *)
                ((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                        super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x40U)) {
              operator_delete((void *)result.m_variant.
                                      super__Variant_base<bilingual_str,_std::monostate>.
                                      super__Move_assign_alias<bilingual_str,_std::monostate>.
                                      super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                      super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                      super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                      _M_u._48_8_,
                              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                              super__Variant_storage_alias<bilingual_str,_std::monostate>._64_8_ + 1
                             );
            }
            if ((void *)CONCAT71(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>
                                 .super__Move_assign_alias<bilingual_str,_std::monostate>.
                                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                 super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                 _17_7_,result.m_variant.
                                        super__Variant_base<bilingual_str,_std::monostate>.
                                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                        super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                        _M_u._M_first._M_storage._M_storage[0x10]) !=
                (void *)((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x20U)) {
              operator_delete((void *)CONCAT71(result.m_variant.
                                               super__Variant_base<bilingual_str,_std::monostate>.
                                               super__Move_assign_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Copy_assign_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Move_ctor_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Variant_storage_alias<bilingual_str,_std::monostate>
                                               ._M_u._17_7_,
                                               result.m_variant.
                                               super__Variant_base<bilingual_str,_std::monostate>.
                                               super__Move_assign_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Copy_assign_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Move_ctor_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Copy_ctor_alias<bilingual_str,_std::monostate>
                                               .
                                               super__Variant_storage_alias<bilingual_str,_std::monostate>
                                               ._M_u._M_first._M_storage._M_storage[0x10]),
                              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                              super__Move_assign_alias<bilingual_str,_std::monostate>.
                              super__Copy_assign_alias<bilingual_str,_std::monostate>.
                              super__Move_ctor_alias<bilingual_str,_std::monostate>.
                              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                              _32_8_ + 1);
            }
            if ((this->m_pool->m_opts).signals != (ValidationSignals *)0x0) {
              pCVar12 = pWVar25->m_ptx;
              tx = (pCVar12->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
              local_9a0 = (vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                           *)pWVar25->m_vsize;
              local_9b0 = ((pWVar25->m_entry)._M_t.
                           super___uniq_ptr_impl<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_CTxMemPoolEntry_*,_std::default_delete<CTxMemPoolEntry>_>
                           .super__Head_base<0UL,_CTxMemPoolEntry_*,_false>._M_head_impl)->
                          entryHeight;
              bVar20 = args->m_bypass_limits;
              local_9d1 = args->m_package_submission;
              bVar21 = IsCurrentForFeeEstimation(this->m_active_chainstate);
              bVar22 = CTxMemPool::HasNoInputsOf(this->m_pool,tx);
              uVar43 = result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                       super__Move_assign_alias<bilingual_str,_std::monostate>.
                       super__Copy_assign_alias<bilingual_str,_std::monostate>.
                       super__Move_ctor_alias<bilingual_str,_std::monostate>.
                       super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                       super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._40_8_;
              peVar7 = (pCVar12->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0] = (uchar)peVar7;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
                   (undefined7)((ulong)peVar7 >> 8);
              p_Var13 = (pCVar12->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                        )._M_refcount._M_pi;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_4_ =
                   SUB84(p_Var13,0);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ =
                   (undefined4)((ulong)p_Var13 >> 0x20);
              if (p_Var13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  p_Var13->_M_use_count = p_Var13->_M_use_count + 1;
                }
              }
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x10] = (uchar)pWVar25->m_base_fees;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ =
                   (undefined7)((ulong)pWVar25->m_base_fees >> 8);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x18] = (uchar)local_9a0;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
                   (undefined7)((ulong)local_9a0 >> 8);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x29] = local_9d1;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x28] = bVar20;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x2a] = bVar21;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._44_4_ =
                   SUB84(uVar43,4);
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
              _M_storage[0x2b] = bVar22;
              pCVar14 = this->m_pool;
              mempool_sequence = pCVar14->m_sequence_number;
              this_00 = (pCVar14->m_opts).signals;
              pCVar14->m_sequence_number = mempool_sequence + 1;
              result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
              super__Move_assign_alias<bilingual_str,_std::monostate>.
              super__Copy_assign_alias<bilingual_str,_std::monostate>.
              super__Move_ctor_alias<bilingual_str,_std::monostate>.
              super__Copy_ctor_alias<bilingual_str,_std::monostate>.
              super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_4_ = local_9b0;
              ValidationSignals::TransactionAddedToMempool
                        (this_00,(NewMempoolTransactionInfo *)&result,mempool_sequence);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  CONCAT44(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                           super__Move_assign_alias<bilingual_str,_std::monostate>.
                           super__Copy_assign_alias<bilingual_str,_std::monostate>.
                           super__Move_ctor_alias<bilingual_str,_std::monostate>.
                           super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                           super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_,
                           result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                           super__Move_assign_alias<bilingual_str,_std::monostate>.
                           super__Copy_assign_alias<bilingual_str,_std::monostate>.
                           super__Move_ctor_alias<bilingual_str,_std::monostate>.
                           super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                           super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_4_)
                  != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           CONCAT44(result.m_variant.
                                    super__Variant_base<bilingual_str,_std::monostate>.
                                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u
                                    ._12_4_,result.m_variant.
                                            super__Variant_base<bilingual_str,_std::monostate>.
                                            super__Move_assign_alias<bilingual_str,_std::monostate>.
                                            super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                            super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                            super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                            super__Variant_storage_alias<bilingual_str,_std::monostate>
                                            ._M_u._8_4_));
              }
            }
            if (effective_feerate_wtxids_1.
                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(effective_feerate_wtxids_1.
                              super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              CONCAT71(effective_feerate_wtxids_1.
                                       super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                                       effective_feerate_wtxids_1.
                                       super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) -
                              (long)effective_feerate_wtxids_1.
                                    super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
          }
          if ((void *)__dnew_1 != (void *)0x0) {
            operator_delete((void *)__dnew_1,auStack_a0._8_8_ - __dnew_1);
          }
          if (((uint)__range1 & 1) == 0) {
            local_8e0._0_4_ = package_state.super_ValidationState<PackageValidationResult>.m_mode;
            local_8e0._4_4_ = package_state.super_ValidationState<PackageValidationResult>.m_result;
            plVar49 = local_8c8;
            local_8d8 = plVar49;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_8d8,
                       package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                       _M_dataplus._M_p,
                       package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                       _M_dataplus._M_p +
                       package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                       _M_string_length);
            local_8b8[0] = local_8a8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_8b8,
                       package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                       _M_dataplus._M_p,
                       package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                       _M_dataplus._M_p +
                       package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                       _M_string_length);
            state_15.super_ValidationState<PackageValidationResult>.m_result._3_1_ = local_9d1;
            state_15.super_ValidationState<PackageValidationResult>._0_7_ = uStack_9d8;
            state_15.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p
                 = (pointer)this;
            state_15.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length
            ._0_4_ = (uint)__range1;
            state_15.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length
            ._4_4_ = __range1._4_4_;
            state_15.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
            _M_allocated_capacity = (size_type)pWVar27;
            state_15.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ =
                 args;
            state_15.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p
            ._0_4_ = local_9b0;
            state_15.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p
            ._4_4_ = uStack_9ac;
            state_15.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length
                 = (size_type)__return_storage_ptr__;
            state_15.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
            _M_allocated_capacity = (size_type)local_9a0;
            state_15.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
                 replaced_txns;
            PackageMempoolAcceptResult::PackageMempoolAcceptResult
                      (__return_storage_ptr__,state_15,
                       (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                        *)local_8e0);
            plVar46 = local_8d8;
            if (local_8b8[0] != local_8a8) {
              operator_delete(local_8b8[0],local_8a8[0] + 1);
              plVar46 = local_8d8;
            }
          }
          else {
            local_928._0_4_ = package_state.super_ValidationState<PackageValidationResult>.m_mode;
            local_928._4_4_ = package_state.super_ValidationState<PackageValidationResult>.m_result;
            plVar49 = local_910;
            local_920 = plVar49;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_920,
                       package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                       _M_dataplus._M_p,
                       package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                       _M_dataplus._M_p +
                       package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                       _M_string_length);
            local_900[0] = local_8f0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_900,
                       package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                       _M_dataplus._M_p,
                       package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                       _M_dataplus._M_p +
                       package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                       _M_string_length);
            state_14.super_ValidationState<PackageValidationResult>.m_result._3_1_ = local_9d1;
            state_14.super_ValidationState<PackageValidationResult>._0_7_ = uStack_9d8;
            state_14.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p
                 = (pointer)this;
            state_14.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length
            ._0_4_ = (uint)__range1;
            state_14.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length
            ._4_4_ = __range1._4_4_;
            state_14.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
            _M_allocated_capacity = (size_type)pWVar27;
            state_14.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ =
                 args;
            state_14.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p
            ._0_4_ = local_9b0;
            state_14.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p
            ._4_4_ = uStack_9ac;
            state_14.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length
                 = (size_type)__return_storage_ptr__;
            state_14.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
            _M_allocated_capacity = (size_type)local_9a0;
            state_14.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
                 replaced_txns;
            PackageMempoolAcceptResult::PackageMempoolAcceptResult
                      (__return_storage_ptr__,state_14,
                       (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                        *)local_928);
            plVar46 = local_920;
            if (local_900[0] != local_8f0) {
              operator_delete(local_900[0],local_8f0[0] + 1);
              plVar46 = local_920;
            }
          }
        }
      }
LAB_00b0e74e:
      if (plVar46 != plVar49) {
        operator_delete(plVar46,*plVar49 + 1);
      }
LAB_00b0e75e:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)placeholder_state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus
             ._M_p !=
          &placeholder_state.super_ValidationState<TxValidationResult>.m_debug_message.field_2) {
        operator_delete(placeholder_state.super_ValidationState<TxValidationResult>.m_debug_message.
                        _M_dataplus._M_p,
                        CONCAT71(placeholder_state.super_ValidationState<TxValidationResult>.
                                 m_debug_message.field_2._M_allocated_capacity._1_7_,
                                 placeholder_state.super_ValidationState<TxValidationResult>.
                                 m_debug_message.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)placeholder_state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus
             ._M_p !=
          &placeholder_state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2) {
        operator_delete(placeholder_state.super_ValidationState<TxValidationResult>.m_reject_reason.
                        _M_dataplus._M_p,
                        CONCAT71(placeholder_state.super_ValidationState<TxValidationResult>.
                                 m_reject_reason.field_2._M_allocated_capacity._1_7_,
                                 placeholder_state.super_ValidationState<TxValidationResult>.
                                 m_reject_reason.field_2._M_local_buf[0]) + 1);
      }
      if (all_package_wtxids.
          super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        pbVar44 = (byte *)((long)all_package_wtxids.
                                 super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)all_package_wtxids.
                                super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        uVar43 = all_package_wtxids.
                 super__Vector_base<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        goto LAB_00b0e7cf;
      }
    }
    else {
      psVar40 = &(local_968.
                  super__Vector_base<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_ancestors;
      while( true ) {
        PackageTRUCChecks_abi_cxx11_
                  (&err,*(CTransactionRef **)(psVar40 + 2),
                   *(int64_t *)
                    ((unique_ptr<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_> *)
                     (psVar40 + 1) + 2),txns,psVar40);
        if (err.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged == true) break;
        pWVar27 = (pointer)(psVar40 + 10);
        psVar40 = psVar40 + 0xc;
        if (pWVar27 == pWVar25) goto LAB_00b0bce9;
      }
      pvVar17 = (void *)((long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                                super__Move_assign_alias<bilingual_str,_std::monostate>.
                                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                super__Copy_ctor_alias<bilingual_str,_std::monostate> + 0x10);
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
      _M_storage[0] = (uchar)pvVar17;
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ =
           (undefined7)((ulong)pvVar17 >> 8);
      std::__cxx11::string::_M_construct<char_const*>((string *)&result,"TRUC-violation","");
      if (err.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged == false) goto LAB_00b0ef71;
      ValidationState<PackageValidationResult>::Invalid
                (&package_state.super_ValidationState<PackageValidationResult>,PCKG_POLICY,
                 (string *)&result,(string *)&err);
      if ((void *)CONCAT71(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                           super__Move_assign_alias<bilingual_str,_std::monostate>.
                           super__Copy_assign_alias<bilingual_str,_std::monostate>.
                           super__Move_ctor_alias<bilingual_str,_std::monostate>.
                           super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                           super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_,
                           result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                           super__Move_assign_alias<bilingual_str,_std::monostate>.
                           super__Copy_assign_alias<bilingual_str,_std::monostate>.
                           super__Move_ctor_alias<bilingual_str,_std::monostate>.
                           super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                           super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first
                           ._M_storage._M_storage[0]) != pvVar17) {
        operator_delete((void *)CONCAT71(result.m_variant.
                                         super__Variant_base<bilingual_str,_std::monostate>.
                                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                         super__Variant_storage_alias<bilingual_str,_std::monostate>
                                         ._M_u._1_7_,
                                         result.m_variant.
                                         super__Variant_base<bilingual_str,_std::monostate>.
                                         super__Move_assign_alias<bilingual_str,_std::monostate>.
                                         super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                         super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                         super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                         super__Variant_storage_alias<bilingual_str,_std::monostate>
                                         ._M_u._M_first._M_storage._M_storage[0]),
                        CONCAT71(result.m_variant.super__Variant_base<bilingual_str,_std::monostate>
                                 .super__Move_assign_alias<bilingual_str,_std::monostate>.
                                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                 super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u.
                                 _17_7_,result.m_variant.
                                        super__Variant_base<bilingual_str,_std::monostate>.
                                        super__Move_assign_alias<bilingual_str,_std::monostate>.
                                        super__Copy_assign_alias<bilingual_str,_std::monostate>.
                                        super__Move_ctor_alias<bilingual_str,_std::monostate>.
                                        super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                                        super__Variant_storage_alias<bilingual_str,_std::monostate>.
                                        _M_u._M_first._M_storage._M_storage[0x10]) + 1);
      }
      local_5c0._0_4_ = package_state.super_ValidationState<PackageValidationResult>.m_mode;
      local_5c0._4_4_ = package_state.super_ValidationState<PackageValidationResult>.m_result;
      local_5b8 = local_5a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_5b8,
                 package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                 _M_dataplus._M_p,
                 package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                 _M_dataplus._M_p +
                 package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                 _M_string_length);
      local_598[0] = local_588;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_598,
                 package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                 _M_dataplus._M_p,
                 package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                 _M_dataplus._M_p +
                 package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                 _M_string_length);
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_ =
           (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate> + 8;
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
      _M_storage[0x10] = '\0';
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ = 0;
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
      _M_storage[0] = '\0';
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ = 0;
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_4_ = 0;
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ = 0;
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage.
      _M_storage[0x18] =
           (uchar)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                  super__Move_assign_alias<bilingual_str,_std::monostate>.
                  super__Copy_assign_alias<bilingual_str,_std::monostate>.
                  super__Move_ctor_alias<bilingual_str,_std::monostate>.
                  super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                  super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_;
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
           (undefined7)
           ((ulong)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                   super__Move_assign_alias<bilingual_str,_std::monostate>.
                   super__Copy_assign_alias<bilingual_str,_std::monostate>.
                   super__Move_ctor_alias<bilingual_str,_std::monostate>.
                   super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                   super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_ >> 8);
      result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
      super__Move_assign_alias<bilingual_str,_std::monostate>.
      super__Copy_assign_alias<bilingual_str,_std::monostate>.
      super__Move_ctor_alias<bilingual_str,_std::monostate>.
      super__Copy_ctor_alias<bilingual_str,_std::monostate>.
      super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._40_8_ = 0;
      state_02.super_ValidationState<PackageValidationResult>.m_result._3_1_ = local_9d1;
      state_02.super_ValidationState<PackageValidationResult>._0_7_ = uStack_9d8;
      state_02.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
           (pointer)this;
      state_02.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length._0_4_
           = (uint)__range1;
      state_02.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length._4_4_
           = __range1._4_4_;
      state_02.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
      _M_allocated_capacity = (size_type)local_9c0;
      state_02.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ = args;
      state_02.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p._0_4_
           = local_9b0;
      state_02.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p._4_4_
           = uStack_9ac;
      state_02.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
           (size_type)__return_storage_ptr__;
      state_02.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
      _M_allocated_capacity = (size_type)txns;
      state_02.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ =
           local_998;
      PackageMempoolAcceptResult::PackageMempoolAcceptResult
                (__return_storage_ptr__,state_02,
                 (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                  *)local_5c0);
      std::
      _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
      ::~_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                   *)&result);
      if (local_598[0] != local_588) {
        operator_delete(local_598[0],local_588[0] + 1);
      }
      if (local_5b8 != local_5a8) {
        operator_delete(local_5b8,(ulong)((long)&local_5a8[0]->_M_color + 1));
      }
      if ((err.
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
           ._M_payload.
           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
           .
           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ._M_engaged != true) ||
         (err.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._32_8_ = err.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._32_8_ & 0xffffffffffffff00,
         local_4d0[0] = (_Base_ptr)
                        err.
                        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                        ._M_payload.
                        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                        .
                        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ._M_payload._16_8_,
         uVar43 = err.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_payload._M_value._M_dataplus._M_p,
         err.
         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
         ._M_payload.
         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
         .
         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ._M_payload._M_value._M_dataplus._M_p ==
         (pointer)((long)&err.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                          ._M_payload.
                          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                          .
                          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ._M_payload + 0x10))) goto LAB_00b0e7d4;
LAB_00b0c90c:
      pbVar44 = (byte *)((long)&local_4d0[0]->_M_color + 1);
LAB_00b0e7cf:
      operator_delete((void *)uVar43,(ulong)pbVar44);
    }
LAB_00b0e7d4:
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock8.super_unique_lock);
    std::
    _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
    ::~_Rb_tree(&results._M_t);
    std::
    vector<(anonymous_namespace)::MemPoolAccept::Workspace,_std::allocator<(anonymous_namespace)::MemPoolAccept::Workspace>_>
    ::~vector(&local_968);
  }
  else {
    local_428._0_4_ = package_state.super_ValidationState<PackageValidationResult>.m_mode;
    local_428._4_4_ = package_state.super_ValidationState<PackageValidationResult>.m_result;
    local_420 = local_410;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_420,
               package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
               _M_dataplus._M_p,
               package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
               _M_dataplus._M_p +
               package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
               _M_string_length);
    local_400[0] = local_3f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_400,
               package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
               _M_dataplus._M_p,
               package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
               _M_dataplus._M_p +
               package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
               _M_string_length);
    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_ =
         (long)&result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                super__Move_assign_alias<bilingual_str,_std::monostate>.
                super__Copy_assign_alias<bilingual_str,_std::monostate>.
                super__Move_ctor_alias<bilingual_str,_std::monostate>.
                super__Copy_ctor_alias<bilingual_str,_std::monostate> + 8;
    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage._M_storage
    [0x10] = '\0';
    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._17_7_ = 0;
    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage._M_storage
    [0] = '\0';
    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._1_7_ = 0;
    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._8_4_ = 0;
    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._12_4_ = 0;
    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._M_first._M_storage._M_storage
    [0x18] = (uchar)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                    super__Move_assign_alias<bilingual_str,_std::monostate>.
                    super__Copy_assign_alias<bilingual_str,_std::monostate>.
                    super__Move_ctor_alias<bilingual_str,_std::monostate>.
                    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_;
    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._25_7_ =
         (undefined7)
         ((ulong)result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
                 super__Move_assign_alias<bilingual_str,_std::monostate>.
                 super__Copy_assign_alias<bilingual_str,_std::monostate>.
                 super__Move_ctor_alias<bilingual_str,_std::monostate>.
                 super__Copy_ctor_alias<bilingual_str,_std::monostate>.
                 super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._32_8_ >> 8);
    result.m_variant.super__Variant_base<bilingual_str,_std::monostate>.
    super__Move_assign_alias<bilingual_str,_std::monostate>.
    super__Copy_assign_alias<bilingual_str,_std::monostate>.
    super__Move_ctor_alias<bilingual_str,_std::monostate>.
    super__Copy_ctor_alias<bilingual_str,_std::monostate>.
    super__Variant_storage_alias<bilingual_str,_std::monostate>._M_u._40_8_ = 0;
    state.super_ValidationState<PackageValidationResult>.m_result._3_1_ = local_9d1;
    state.super_ValidationState<PackageValidationResult>._0_7_ = uStack_9d8;
    state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)local_9d0;
    state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length._0_4_ =
         (uint)__range1;
    state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_string_length._4_4_ =
         __range1._4_4_;
    state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2.
    _M_allocated_capacity = (size_type)local_9c0;
    state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2._8_8_ = local_9b8;
    state.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p._0_4_ =
         local_9b0;
    state.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus._M_p._4_4_ =
         uStack_9ac;
    state.super_ValidationState<PackageValidationResult>.m_debug_message._M_string_length =
         local_9a8;
    state.super_ValidationState<PackageValidationResult>.m_debug_message.field_2.
    _M_allocated_capacity = (size_type)local_9a0;
    state.super_ValidationState<PackageValidationResult>.m_debug_message.field_2._8_8_ = local_998;
    PackageMempoolAcceptResult::PackageMempoolAcceptResult
              (__return_storage_ptr__,state,
               (map<uint256,_MempoolAcceptResult,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                *)local_428);
    std::
    _Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
    ::~_Rb_tree((_Rb_tree<uint256,_std::pair<const_uint256,_MempoolAcceptResult>,_std::_Select1st<std::pair<const_uint256,_MempoolAcceptResult>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_MempoolAcceptResult>_>_>
                 *)&result);
    if (local_400[0] != local_3f0) {
      operator_delete(local_400[0],local_3f0[0] + 1);
    }
    if (local_420 != local_410) {
      operator_delete(local_420,(ulong)((long)&local_410[0]->_M_color + 1));
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)package_state.super_ValidationState<PackageValidationResult>.m_debug_message._M_dataplus.
         _M_p !=
      &package_state.super_ValidationState<PackageValidationResult>.m_debug_message.field_2) {
    operator_delete(package_state.super_ValidationState<PackageValidationResult>.m_debug_message.
                    _M_dataplus._M_p,
                    CONCAT71(package_state.super_ValidationState<PackageValidationResult>.
                             m_debug_message.field_2._M_allocated_capacity._1_7_,
                             package_state.super_ValidationState<PackageValidationResult>.
                             m_debug_message.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)package_state.super_ValidationState<PackageValidationResult>.m_reject_reason._M_dataplus.
         _M_p !=
      &package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.field_2) {
    operator_delete(package_state.super_ValidationState<PackageValidationResult>.m_reject_reason.
                    _M_dataplus._M_p,
                    CONCAT71(package_state.super_ValidationState<PackageValidationResult>.
                             m_reject_reason.field_2._M_allocated_capacity._1_7_,
                             package_state.super_ValidationState<PackageValidationResult>.
                             m_reject_reason.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
    return __return_storage_ptr__;
  }
LAB_00b0fda7:
  __stack_chk_fail();
LAB_00b0ef32:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
    std::__throw_bad_optional_access();
  }
  goto LAB_00b0fda7;
}

Assistant:

PackageMempoolAcceptResult MemPoolAccept::AcceptMultipleTransactions(const std::vector<CTransactionRef>& txns, ATMPArgs& args)
{
    AssertLockHeld(cs_main);

    // These context-free package limits can be done before taking the mempool lock.
    PackageValidationState package_state;
    if (!IsWellFormedPackage(txns, package_state, /*require_sorted=*/true)) return PackageMempoolAcceptResult(package_state, {});

    std::vector<Workspace> workspaces{};
    workspaces.reserve(txns.size());
    std::transform(txns.cbegin(), txns.cend(), std::back_inserter(workspaces),
                   [](const auto& tx) { return Workspace(tx); });
    std::map<uint256, MempoolAcceptResult> results;

    LOCK(m_pool.cs);

    // Do all PreChecks first and fail fast to avoid running expensive script checks when unnecessary.
    for (Workspace& ws : workspaces) {
        if (!PreChecks(args, ws)) {
            package_state.Invalid(PackageValidationResult::PCKG_TX, "transaction failed");
            // Exit early to avoid doing pointless work. Update the failed tx result; the rest are unfinished.
            results.emplace(ws.m_ptx->GetWitnessHash(), MempoolAcceptResult::Failure(ws.m_state));
            return PackageMempoolAcceptResult(package_state, std::move(results));
        }

        // Individual modified feerate exceeded caller-defined max; abort
        // N.B. this doesn't take into account CPFPs. Chunk-aware validation may be more robust.
        if (args.m_client_maxfeerate && CFeeRate(ws.m_modified_fees, ws.m_vsize) > args.m_client_maxfeerate.value()) {
            // Need to set failure here both individually and at package level
            ws.m_state.Invalid(TxValidationResult::TX_MEMPOOL_POLICY, "max feerate exceeded", "");
            package_state.Invalid(PackageValidationResult::PCKG_TX, "transaction failed");
            // Exit early to avoid doing pointless work. Update the failed tx result; the rest are unfinished.
            results.emplace(ws.m_ptx->GetWitnessHash(), MempoolAcceptResult::Failure(ws.m_state));
            return PackageMempoolAcceptResult(package_state, std::move(results));
        }

        // Make the coins created by this transaction available for subsequent transactions in the
        // package to spend. If there are no conflicts within the package, no transaction can spend a coin
        // needed by another transaction in the package. We also need to make sure that no package
        // tx replaces (or replaces the ancestor of) the parent of another package tx. As long as we
        // check these two things, we don't need to track the coins spent.
        // If a package tx conflicts with a mempool tx, PackageMempoolChecks() ensures later that any package RBF attempt
        // has *no* in-mempool ancestors, so we don't have to worry about subsequent transactions in
        // same package spending the same in-mempool outpoints. This needs to be revisited for general
        // package RBF.
        m_viewmempool.PackageAddTransaction(ws.m_ptx);
    }

    // At this point we have all in-mempool ancestors, and we know every transaction's vsize.
    // Run the TRUC checks on the package.
    for (Workspace& ws : workspaces) {
        if (auto err{PackageTRUCChecks(ws.m_ptx, ws.m_vsize, txns, ws.m_ancestors)}) {
            package_state.Invalid(PackageValidationResult::PCKG_POLICY, "TRUC-violation", err.value());
            return PackageMempoolAcceptResult(package_state, {});
        }
    }

    // Transactions must meet two minimum feerates: the mempool minimum fee and min relay fee.
    // For transactions consisting of exactly one child and its parents, it suffices to use the
    // package feerate (total modified fees / total virtual size) to check this requirement.
    // Note that this is an aggregate feerate; this function has not checked that there are transactions
    // too low feerate to pay for themselves, or that the child transactions are higher feerate than
    // their parents. Using aggregate feerate may allow "parents pay for child" behavior and permit
    // a child that is below mempool minimum feerate. To avoid these behaviors, callers of
    // AcceptMultipleTransactions need to restrict txns topology (e.g. to ancestor sets) and check
    // the feerates of individuals and subsets.
    m_subpackage.m_total_vsize = std::accumulate(workspaces.cbegin(), workspaces.cend(), int64_t{0},
        [](int64_t sum, auto& ws) { return sum + ws.m_vsize; });
    m_subpackage.m_total_modified_fees = std::accumulate(workspaces.cbegin(), workspaces.cend(), CAmount{0},
        [](CAmount sum, auto& ws) { return sum + ws.m_modified_fees; });
    const CFeeRate package_feerate(m_subpackage.m_total_modified_fees, m_subpackage.m_total_vsize);
    std::vector<Wtxid> all_package_wtxids;
    all_package_wtxids.reserve(workspaces.size());
    std::transform(workspaces.cbegin(), workspaces.cend(), std::back_inserter(all_package_wtxids),
                   [](const auto& ws) { return ws.m_ptx->GetWitnessHash(); });
    TxValidationState placeholder_state;
    if (args.m_package_feerates &&
        !CheckFeeRate(m_subpackage.m_total_vsize, m_subpackage.m_total_modified_fees, placeholder_state)) {
        package_state.Invalid(PackageValidationResult::PCKG_TX, "transaction failed");
        return PackageMempoolAcceptResult(package_state, {{workspaces.back().m_ptx->GetWitnessHash(),
            MempoolAcceptResult::FeeFailure(placeholder_state, CFeeRate(m_subpackage.m_total_modified_fees, m_subpackage.m_total_vsize), all_package_wtxids)}});
    }

    // Apply package mempool ancestor/descendant limits. Skip if there is only one transaction,
    // because it's unnecessary.
    if (txns.size() > 1 && !PackageMempoolChecks(txns, workspaces, m_subpackage.m_total_vsize, package_state)) {
        return PackageMempoolAcceptResult(package_state, std::move(results));
    }

    for (Workspace& ws : workspaces) {
        ws.m_package_feerate = package_feerate;
        if (!PolicyScriptChecks(args, ws)) {
            // Exit early to avoid doing pointless work. Update the failed tx result; the rest are unfinished.
            package_state.Invalid(PackageValidationResult::PCKG_TX, "transaction failed");
            results.emplace(ws.m_ptx->GetWitnessHash(), MempoolAcceptResult::Failure(ws.m_state));
            return PackageMempoolAcceptResult(package_state, std::move(results));
        }
        if (args.m_test_accept) {
            const auto effective_feerate = args.m_package_feerates ? ws.m_package_feerate :
                CFeeRate{ws.m_modified_fees, static_cast<uint32_t>(ws.m_vsize)};
            const auto effective_feerate_wtxids = args.m_package_feerates ? all_package_wtxids :
                std::vector<Wtxid>{ws.m_ptx->GetWitnessHash()};
            results.emplace(ws.m_ptx->GetWitnessHash(),
                            MempoolAcceptResult::Success(std::move(m_subpackage.m_replaced_transactions),
                                                         ws.m_vsize, ws.m_base_fees, effective_feerate,
                                                         effective_feerate_wtxids));
        }
    }

    if (args.m_test_accept) return PackageMempoolAcceptResult(package_state, std::move(results));

    if (!SubmitPackage(args, workspaces, package_state, results)) {
        // PackageValidationState filled in by SubmitPackage().
        return PackageMempoolAcceptResult(package_state, std::move(results));
    }

    return PackageMempoolAcceptResult(package_state, std::move(results));
}